

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  float *pfVar5;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  byte bVar62;
  byte bVar63;
  ulong uVar64;
  byte bVar65;
  long lVar66;
  long lVar67;
  undefined1 uVar68;
  undefined1 uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar125;
  uint uVar126;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  uint uVar128;
  uint uVar129;
  uint uVar130;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar127;
  uint uVar131;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  float fVar132;
  undefined4 uVar133;
  vint4 bi_2;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar143 [16];
  undefined1 auVar149 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar150;
  float fVar151;
  float fVar166;
  float fVar168;
  vint4 bi_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 bi;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  vint4 ai_2;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  vint4 ai_1;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vint4 ai;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar248 [32];
  undefined1 auVar247 [28];
  undefined1 auVar249 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [64];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  RTCFilterFunctionNArguments args;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_8f0;
  undefined2 local_8ea;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  ulong local_8b8;
  undefined1 local_8b0 [16];
  RTCFilterFunctionNArguments local_8a0;
  undefined4 local_86c;
  uint local_868;
  int local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [16];
  undefined8 local_630;
  float local_628;
  float local_624;
  undefined4 local_620;
  uint local_61c;
  uint local_618;
  uint local_614;
  uint local_610;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  Primitive *local_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined4 local_320;
  undefined4 uStack_31c;
  undefined4 uStack_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  int iVar2;
  int iVar3;
  int iVar4;
  
  PVar8 = prim[1];
  uVar64 = (ulong)(byte)PVar8;
  lVar67 = uVar64 * 0x25;
  fVar150 = *(float *)(prim + lVar67 + 0x12);
  auVar81 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar67 + 6));
  auVar178._0_4_ = fVar150 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar178._4_4_ = fVar150 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar178._8_4_ = fVar150 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar178._12_4_ = fVar150 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar216._0_4_ = fVar150 * auVar81._0_4_;
  auVar216._4_4_ = fVar150 * auVar81._4_4_;
  auVar216._8_4_ = fVar150 * auVar81._8_4_;
  auVar216._12_4_ = fVar150 * auVar81._12_4_;
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar64 + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar224._4_4_ = auVar178._0_4_;
  auVar224._0_4_ = auVar178._0_4_;
  auVar224._8_4_ = auVar178._0_4_;
  auVar224._12_4_ = auVar178._0_4_;
  auVar23 = vshufps_avx(auVar178,auVar178,0x55);
  auVar24 = vshufps_avx(auVar178,auVar178,0xaa);
  fVar150 = auVar24._0_4_;
  auVar179._0_4_ = fVar150 * auVar75._0_4_;
  fVar166 = auVar24._4_4_;
  auVar179._4_4_ = fVar166 * auVar75._4_4_;
  fVar168 = auVar24._8_4_;
  auVar179._8_4_ = fVar168 * auVar75._8_4_;
  fVar170 = auVar24._12_4_;
  auVar179._12_4_ = fVar170 * auVar75._12_4_;
  auVar152._0_4_ = auVar76._0_4_ * fVar150;
  auVar152._4_4_ = auVar76._4_4_ * fVar166;
  auVar152._8_4_ = auVar76._8_4_ * fVar168;
  auVar152._12_4_ = auVar76._12_4_ * fVar170;
  auVar134._0_4_ = auVar77._0_4_ * fVar150;
  auVar134._4_4_ = auVar77._4_4_ * fVar166;
  auVar134._8_4_ = auVar77._8_4_ * fVar168;
  auVar134._12_4_ = auVar77._12_4_ * fVar170;
  auVar24 = vfmadd231ps_fma(auVar179,auVar23,auVar81);
  auVar30 = vfmadd231ps_fma(auVar152,auVar23,auVar85);
  auVar23 = vfmadd231ps_fma(auVar134,auVar86,auVar23);
  auVar24 = vfmadd231ps_fma(auVar24,auVar224,auVar82);
  auVar30 = vfmadd231ps_fma(auVar30,auVar224,auVar84);
  auVar31 = vfmadd231ps_fma(auVar23,auVar83,auVar224);
  auVar255._4_4_ = auVar216._0_4_;
  auVar255._0_4_ = auVar216._0_4_;
  auVar255._8_4_ = auVar216._0_4_;
  auVar255._12_4_ = auVar216._0_4_;
  auVar23 = vshufps_avx(auVar216,auVar216,0x55);
  auVar256 = ZEXT1664(auVar23);
  auVar74 = vshufps_avx512vl(auVar216,auVar216,0xaa);
  auVar75 = vmulps_avx512vl(auVar74,auVar75);
  auVar76 = vmulps_avx512vl(auVar74,auVar76);
  auVar77 = vmulps_avx512vl(auVar74,auVar77);
  auVar81 = vfmadd231ps_fma(auVar75,auVar23,auVar81);
  auVar75 = vfmadd231ps_fma(auVar76,auVar23,auVar85);
  auVar85 = vfmadd231ps_fma(auVar77,auVar23,auVar86);
  auVar32 = vfmadd231ps_fma(auVar81,auVar255,auVar82);
  auVar134 = vfmadd231ps_fma(auVar75,auVar255,auVar84);
  auVar244._8_4_ = 0x7fffffff;
  auVar244._0_8_ = 0x7fffffff7fffffff;
  auVar244._12_4_ = 0x7fffffff;
  auVar135 = vfmadd231ps_fma(auVar85,auVar255,auVar83);
  auVar82 = vandps_avx(auVar244,auVar24);
  auVar238._8_4_ = 0x219392ef;
  auVar238._0_8_ = 0x219392ef219392ef;
  auVar238._12_4_ = 0x219392ef;
  uVar70 = vcmpps_avx512vl(auVar82,auVar238,1);
  bVar14 = (bool)((byte)uVar70 & 1);
  auVar78._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._0_4_;
  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._4_4_;
  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._8_4_;
  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar24._12_4_;
  auVar82 = vandps_avx(auVar244,auVar30);
  uVar70 = vcmpps_avx512vl(auVar82,auVar238,1);
  bVar14 = (bool)((byte)uVar70 & 1);
  auVar79._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar30._0_4_;
  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar30._4_4_;
  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar30._8_4_;
  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar30._12_4_;
  auVar82 = vandps_avx(auVar244,auVar31);
  uVar70 = vcmpps_avx512vl(auVar82,auVar238,1);
  bVar14 = (bool)((byte)uVar70 & 1);
  auVar80._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar31._0_4_;
  bVar14 = (bool)((byte)(uVar70 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar31._4_4_;
  bVar14 = (bool)((byte)(uVar70 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar31._8_4_;
  bVar14 = (bool)((byte)(uVar70 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar31._12_4_;
  auVar81 = vrcp14ps_avx512vl(auVar78);
  auVar239._8_4_ = 0x3f800000;
  auVar239._0_8_ = 0x3f8000003f800000;
  auVar239._12_4_ = 0x3f800000;
  auVar82 = vfnmadd213ps_fma(auVar78,auVar81,auVar239);
  auVar31 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar79);
  auVar82 = vfnmadd213ps_fma(auVar79,auVar81,auVar239);
  auVar74 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
  auVar81 = vrcp14ps_avx512vl(auVar80);
  auVar82 = vfnmadd213ps_fma(auVar80,auVar81,auVar239);
  auVar29 = vfmadd132ps_fma(auVar82,auVar81,auVar81);
  fVar150 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar67 + 0x16)) *
            *(float *)(prim + lVar67 + 0x1a);
  auVar232._4_4_ = fVar150;
  auVar232._0_4_ = fVar150;
  auVar232._8_4_ = fVar150;
  auVar232._12_4_ = fVar150;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar82 = vpmovsxwd_avx(auVar82);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar84 = vsubps_avx(auVar81,auVar82);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar81 = vpmovsxwd_avx(auVar75);
  auVar75 = vfmadd213ps_fma(auVar84,auVar232,auVar82);
  auVar82 = vcvtdq2ps_avx(auVar81);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar81 = vpmovsxwd_avx(auVar84);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar84 = vfmadd213ps_fma(auVar81,auVar232,auVar82);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar82 = vpmovsxwd_avx(auVar85);
  auVar82 = vcvtdq2ps_avx(auVar82);
  uVar70 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar70 + 6);
  auVar81 = vpmovsxwd_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar85 = vfmadd213ps_fma(auVar81,auVar232,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar70 + 6);
  auVar82 = vpmovsxwd_avx(auVar83);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar81 = vpmovsxwd_avx(auVar86);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar76 = vfmadd213ps_fma(auVar81,auVar232,auVar82);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar82 = vpmovsxwd_avx(auVar77);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar8 * 0x20 + 6);
  auVar81 = vpmovsxwd_avx(auVar23);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar83 = vfmadd213ps_fma(auVar81,auVar232,auVar82);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar8 * 0x20 - uVar64) + 6);
  auVar82 = vpmovsxwd_avx(auVar24);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar81 = vpmovsxwd_avx(auVar30);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,auVar82);
  auVar81 = vfmadd213ps_fma(auVar81,auVar232,auVar82);
  auVar82 = vsubps_avx(auVar75,auVar32);
  auVar233._0_4_ = auVar31._0_4_ * auVar82._0_4_;
  auVar233._4_4_ = auVar31._4_4_ * auVar82._4_4_;
  auVar233._8_4_ = auVar31._8_4_ * auVar82._8_4_;
  auVar233._12_4_ = auVar31._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar84,auVar32);
  auVar180._0_4_ = auVar31._0_4_ * auVar82._0_4_;
  auVar180._4_4_ = auVar31._4_4_ * auVar82._4_4_;
  auVar180._8_4_ = auVar31._8_4_ * auVar82._8_4_;
  auVar180._12_4_ = auVar31._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar85,auVar134);
  auVar225._0_4_ = auVar74._0_4_ * auVar82._0_4_;
  auVar225._4_4_ = auVar74._4_4_ * auVar82._4_4_;
  auVar225._8_4_ = auVar74._8_4_ * auVar82._8_4_;
  auVar225._12_4_ = auVar74._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar76,auVar134);
  auVar153._0_4_ = auVar74._0_4_ * auVar82._0_4_;
  auVar153._4_4_ = auVar74._4_4_ * auVar82._4_4_;
  auVar153._8_4_ = auVar74._8_4_ * auVar82._8_4_;
  auVar153._12_4_ = auVar74._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar83,auVar135);
  auVar217._0_4_ = auVar29._0_4_ * auVar82._0_4_;
  auVar217._4_4_ = auVar29._4_4_ * auVar82._4_4_;
  auVar217._8_4_ = auVar29._8_4_ * auVar82._8_4_;
  auVar217._12_4_ = auVar29._12_4_ * auVar82._12_4_;
  auVar82 = vsubps_avx(auVar81,auVar135);
  auVar135._0_4_ = auVar29._0_4_ * auVar82._0_4_;
  auVar135._4_4_ = auVar29._4_4_ * auVar82._4_4_;
  auVar135._8_4_ = auVar29._8_4_ * auVar82._8_4_;
  auVar135._12_4_ = auVar29._12_4_ * auVar82._12_4_;
  auVar82 = vpminsd_avx(auVar233,auVar180);
  auVar81 = vpminsd_avx(auVar225,auVar153);
  auVar82 = vmaxps_avx(auVar82,auVar81);
  auVar81 = vpminsd_avx(auVar217,auVar135);
  uVar133 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar31._4_4_ = uVar133;
  auVar31._0_4_ = uVar133;
  auVar31._8_4_ = uVar133;
  auVar31._12_4_ = uVar133;
  auVar81 = vmaxps_avx512vl(auVar81,auVar31);
  auVar82 = vmaxps_avx(auVar82,auVar81);
  auVar74._8_4_ = 0x3f7ffffa;
  auVar74._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar74._12_4_ = 0x3f7ffffa;
  local_2c0 = vmulps_avx512vl(auVar82,auVar74);
  auVar82 = vpmaxsd_avx(auVar233,auVar180);
  auVar81 = vpmaxsd_avx(auVar225,auVar153);
  auVar82 = vminps_avx(auVar82,auVar81);
  auVar81 = vpmaxsd_avx(auVar217,auVar135);
  fVar150 = (ray->super_RayK<1>).tfar;
  auVar29._4_4_ = fVar150;
  auVar29._0_4_ = fVar150;
  auVar29._8_4_ = fVar150;
  auVar29._12_4_ = fVar150;
  auVar81 = vminps_avx512vl(auVar81,auVar29);
  auVar82 = vminps_avx(auVar82,auVar81);
  auVar32._8_4_ = 0x3f800003;
  auVar32._0_8_ = 0x3f8000033f800003;
  auVar32._12_4_ = 0x3f800003;
  auVar82 = vmulps_avx512vl(auVar82,auVar32);
  auVar81 = vpbroadcastd_avx512vl();
  uVar25 = vcmpps_avx512vl(local_2c0,auVar82,2);
  uVar70 = vpcmpgtd_avx512vl(auVar81,_DAT_01f7fcf0);
  uVar70 = ((byte)uVar25 & 0xf) & uVar70;
  if ((char)uVar70 == '\0') {
    return;
  }
  local_4c8 = prim;
LAB_01b60e7d:
  lVar67 = 0;
  for (uVar64 = uVar70; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    lVar67 = lVar67 + 1;
  }
  local_8e8 = (ulong)*(uint *)(prim + 2);
  pGVar9 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_8b8 = (ulong)*(uint *)(prim + lVar67 * 4 + 6);
  uVar64 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(prim + lVar67 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar150 = (pGVar9->time_range).lower;
  fVar150 = pGVar9->fnumTimeSegments *
            (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar150) /
            ((pGVar9->time_range).upper - fVar150));
  auVar82 = vroundss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),9);
  auVar82 = vminss_avx(auVar82,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar82 = vmaxss_avx(ZEXT816(0) << 0x20,auVar82);
  fVar150 = fVar150 - auVar82._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar66 = (long)(int)auVar82._0_4_ * 0x38;
  lVar67 = *(long *)(_Var10 + 0x10 + lVar66);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar66);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar66);
  pfVar5 = (float *)(lVar11 + uVar64 * lVar12);
  auVar181._0_4_ = fVar150 * *pfVar5;
  auVar181._4_4_ = fVar150 * pfVar5[1];
  auVar181._8_4_ = fVar150 * pfVar5[2];
  auVar181._12_4_ = fVar150 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + (uVar64 + 1) * lVar12);
  auVar202._0_4_ = fVar150 * *pfVar5;
  auVar202._4_4_ = fVar150 * pfVar5[1];
  auVar202._8_4_ = fVar150 * pfVar5[2];
  auVar202._12_4_ = fVar150 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + (uVar64 + 2) * lVar12);
  auVar218._0_4_ = fVar150 * *pfVar5;
  auVar218._4_4_ = fVar150 * pfVar5[1];
  auVar218._8_4_ = fVar150 * pfVar5[2];
  auVar218._12_4_ = fVar150 * pfVar5[3];
  pfVar5 = (float *)(lVar11 + lVar12 * (uVar64 + 3));
  auVar154._0_4_ = fVar150 * *pfVar5;
  auVar154._4_4_ = fVar150 * pfVar5[1];
  auVar154._8_4_ = fVar150 * pfVar5[2];
  auVar154._12_4_ = fVar150 * pfVar5[3];
  lVar11 = *(long *)(_Var10 + lVar66);
  fVar150 = 1.0 - fVar150;
  auVar136._4_4_ = fVar150;
  auVar136._0_4_ = fVar150;
  auVar136._8_4_ = fVar150;
  auVar136._12_4_ = fVar150;
  auVar75 = vfmadd231ps_fma(auVar181,auVar136,*(undefined1 (*) [16])(lVar11 + lVar67 * uVar64));
  auVar84 = vfmadd231ps_fma(auVar202,auVar136,*(undefined1 (*) [16])(lVar11 + lVar67 * (uVar64 + 1))
                           );
  auVar85 = vfmadd231ps_fma(auVar218,auVar136,*(undefined1 (*) [16])(lVar11 + lVar67 * (uVar64 + 2))
                           );
  auVar76 = vfmadd231ps_fma(auVar154,auVar136,*(undefined1 (*) [16])(lVar11 + lVar67 * (uVar64 + 3))
                           );
  auVar226._0_4_ = auVar75._0_4_ + auVar84._0_4_ + auVar85._0_4_ + auVar76._0_4_;
  auVar226._4_4_ = auVar75._4_4_ + auVar84._4_4_ + auVar85._4_4_ + auVar76._4_4_;
  auVar226._8_4_ = auVar75._8_4_ + auVar84._8_4_ + auVar85._8_4_ + auVar76._8_4_;
  auVar226._12_4_ = auVar75._12_4_ + auVar84._12_4_ + auVar85._12_4_ + auVar76._12_4_;
  aVar6 = (ray->super_RayK<1>).org.field_0;
  aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar33._8_4_ = 0x3e800000;
  auVar33._0_8_ = 0x3e8000003e800000;
  auVar33._12_4_ = 0x3e800000;
  auVar82 = vmulps_avx512vl(auVar226,auVar33);
  auVar82 = vsubps_avx(auVar82,(undefined1  [16])aVar6);
  auVar82 = vdpps_avx(auVar82,(undefined1  [16])aVar7,0x7f);
  auVar81 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
  auVar245._4_12_ = ZEXT812(0) << 0x20;
  auVar245._0_4_ = auVar81._0_4_;
  auVar83 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar245);
  auVar81 = vfnmadd213ss_fma(auVar83,auVar81,ZEXT416(0x40000000));
  fVar150 = auVar82._0_4_ * auVar83._0_4_ * auVar81._0_4_;
  local_520 = ZEXT416((uint)fVar150);
  auVar227._4_4_ = fVar150;
  auVar227._0_4_ = fVar150;
  auVar227._8_4_ = fVar150;
  auVar227._12_4_ = fVar150;
  fStack_590 = fVar150;
  _local_5a0 = auVar227;
  fStack_58c = fVar150;
  fStack_588 = fVar150;
  fStack_584 = fVar150;
  auVar82 = vfmadd231ps_fma((undefined1  [16])aVar6,(undefined1  [16])aVar7,auVar227);
  auVar82 = vblendps_avx(auVar82,ZEXT816(0) << 0x40,8);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar268 = ZEXT3264(auVar87);
  auVar81 = vsubps_avx(auVar75,auVar82);
  uVar133 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_300._4_4_ = uVar133;
  local_300._0_4_ = uVar133;
  local_300._8_4_ = uVar133;
  local_300._12_4_ = uVar133;
  local_300._16_4_ = uVar133;
  local_300._20_4_ = uVar133;
  local_300._24_4_ = uVar133;
  local_300._28_4_ = uVar133;
  auVar75 = vsubps_avx(auVar85,auVar82);
  uVar133 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_780._4_4_ = uVar133;
  local_780._0_4_ = uVar133;
  local_780._8_4_ = uVar133;
  local_780._12_4_ = uVar133;
  local_780._16_4_ = uVar133;
  local_780._20_4_ = uVar133;
  local_780._24_4_ = uVar133;
  local_780._28_4_ = uVar133;
  local_320 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
  uStack_31c = local_320;
  uStack_318 = local_320;
  uStack_314 = local_320;
  uStack_310 = local_320;
  uStack_30c = local_320;
  uStack_308 = local_320;
  uStack_304 = local_320;
  auVar84 = vsubps_avx(auVar84,auVar82);
  auVar82 = vsubps_avx(auVar76,auVar82);
  uVar133 = auVar81._0_4_;
  local_720._4_4_ = uVar133;
  local_720._0_4_ = uVar133;
  local_720._8_4_ = uVar133;
  local_720._12_4_ = uVar133;
  local_720._16_4_ = uVar133;
  local_720._20_4_ = uVar133;
  local_720._24_4_ = uVar133;
  local_720._28_4_ = uVar133;
  auVar246 = ZEXT3264(local_720);
  auVar88._8_4_ = 1;
  auVar88._0_8_ = 0x100000001;
  auVar88._12_4_ = 1;
  auVar88._16_4_ = 1;
  auVar88._20_4_ = 1;
  auVar88._24_4_ = 1;
  auVar88._28_4_ = 1;
  local_440 = ZEXT1632(auVar81);
  local_740 = vpermps_avx2(auVar88,local_440);
  auVar249 = ZEXT3264(local_740);
  auVar89._8_4_ = 2;
  auVar89._0_8_ = 0x200000002;
  auVar89._12_4_ = 2;
  auVar89._16_4_ = 2;
  auVar89._20_4_ = 2;
  auVar89._24_4_ = 2;
  auVar89._28_4_ = 2;
  local_760 = vpermps_avx2(auVar89,local_440);
  auVar251 = ZEXT3264(local_760);
  auVar90._8_4_ = 3;
  auVar90._0_8_ = 0x300000003;
  auVar90._12_4_ = 3;
  auVar90._16_4_ = 3;
  auVar90._20_4_ = 3;
  auVar90._24_4_ = 3;
  auVar90._28_4_ = 3;
  local_600 = vpermps_avx2(auVar90,local_440);
  auVar253 = ZEXT3264(local_600);
  uVar133 = auVar84._0_4_;
  local_420._4_4_ = uVar133;
  local_420._0_4_ = uVar133;
  local_420._8_4_ = uVar133;
  local_420._12_4_ = uVar133;
  local_420._16_4_ = uVar133;
  local_420._20_4_ = uVar133;
  local_420._24_4_ = uVar133;
  local_420._28_4_ = uVar133;
  auVar237 = ZEXT3264(local_420);
  local_480 = ZEXT1632(auVar84);
  local_680 = vpermps_avx2(auVar88,local_480);
  auVar254 = ZEXT3264(local_680);
  local_7a0 = vpermps_avx512vl(auVar89,local_480);
  auVar263 = ZEXT3264(local_7a0);
  local_7c0 = vpermps_avx512vl(auVar90,local_480);
  auVar266 = ZEXT3264(local_7c0);
  local_7e0 = vbroadcastss_avx512vl(auVar75);
  auVar257 = ZEXT3264(local_7e0);
  local_460 = ZEXT1632(auVar75);
  local_800 = vpermps_avx512vl(auVar88,local_460);
  auVar258 = ZEXT3264(local_800);
  local_6a0 = vpermps_avx512vl(auVar89,local_460);
  auVar259 = ZEXT3264(local_6a0);
  local_820 = vpermps_avx512vl(auVar90,local_460);
  auVar260 = ZEXT3264(local_820);
  local_6c0 = vbroadcastss_avx512vl(auVar82);
  auVar267 = ZEXT3264(local_6c0);
  _local_4a0 = ZEXT1632(auVar82);
  local_840 = vpermps_avx512vl(auVar88,_local_4a0);
  auVar262 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar89,_local_4a0);
  auVar264 = ZEXT3264(local_860);
  local_6e0 = vpermps_avx512vl(auVar90,_local_4a0);
  auVar261 = ZEXT3264(local_6e0);
  auVar87 = vpermps_avx512vl(auVar89,ZEXT1632(CONCAT412(aVar7.field_3.w * aVar7.field_3.w,
                                                        CONCAT48(aVar7.z * aVar7.z,
                                                                 CONCAT44(aVar7.y * aVar7.y,
                                                                          aVar7.x * aVar7.x)))));
  auVar87 = vfmadd231ps_avx512vl(auVar87,local_780,local_780);
  local_1e0 = vfmadd231ps_avx512vl(auVar87,local_300,local_300);
  auVar265 = ZEXT3264(local_1e0);
  auVar87._8_4_ = 0x7fffffff;
  auVar87._0_8_ = 0x7fffffff7fffffff;
  auVar87._12_4_ = 0x7fffffff;
  auVar87._16_4_ = 0x7fffffff;
  auVar87._20_4_ = 0x7fffffff;
  auVar87._24_4_ = 0x7fffffff;
  auVar87._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar87);
  local_864 = 1;
  uVar64 = 0;
  local_2b0 = ZEXT816(0x3f80000000000000);
  local_5e0 = local_1e0;
  do {
    auVar82 = vmovshdup_avx(local_2b0);
    auVar82 = vsubps_avx(auVar82,local_2b0);
    fVar150 = auVar82._0_4_;
    fVar132 = fVar150 * 0.04761905;
    local_8e0._0_4_ = local_2b0._0_4_;
    local_8e0._4_4_ = local_8e0._0_4_;
    fStack_8d8 = (float)local_8e0._0_4_;
    fStack_8d4 = (float)local_8e0._0_4_;
    register0x000012d0 = local_8e0._0_4_;
    register0x000012d4 = local_8e0._0_4_;
    register0x000012d8 = local_8e0._0_4_;
    register0x000012dc = local_8e0._0_4_;
    auVar219._4_4_ = fVar150;
    auVar219._0_4_ = fVar150;
    auVar219._8_4_ = fVar150;
    auVar219._12_4_ = fVar150;
    register0x00001310 = fVar150;
    _local_700 = auVar219;
    register0x00001314 = fVar150;
    register0x00001318 = fVar150;
    register0x0000131c = fVar150;
    auVar82 = vfmadd231ps_fma(_local_8e0,_local_700,_DAT_01faff20);
    auVar111 = auVar268._0_32_;
    auVar87 = vsubps_avx512vl(auVar111,ZEXT1632(auVar82));
    fVar150 = auVar82._0_4_;
    fVar166 = auVar82._4_4_;
    auVar100._4_4_ = auVar237._4_4_ * fVar166;
    auVar100._0_4_ = auVar237._0_4_ * fVar150;
    fVar168 = auVar82._8_4_;
    auVar100._8_4_ = auVar237._8_4_ * fVar168;
    fVar170 = auVar82._12_4_;
    auVar100._12_4_ = auVar237._12_4_ * fVar170;
    auVar100._16_4_ = auVar237._16_4_ * 0.0;
    auVar100._20_4_ = auVar237._20_4_ * 0.0;
    auVar100._24_4_ = auVar237._24_4_ * 0.0;
    auVar100._28_4_ = DAT_01faff20._28_4_;
    auVar90 = ZEXT1632(auVar82);
    auVar91._4_4_ = auVar254._4_4_ * fVar166;
    auVar91._0_4_ = auVar254._0_4_ * fVar150;
    auVar91._8_4_ = auVar254._8_4_ * fVar168;
    auVar91._12_4_ = auVar254._12_4_ * fVar170;
    auVar91._16_4_ = auVar254._16_4_ * 0.0;
    auVar91._20_4_ = auVar254._20_4_ * 0.0;
    auVar91._24_4_ = auVar254._24_4_ * 0.0;
    auVar91._28_4_ = local_8e0._0_4_;
    auVar88 = vmulps_avx512vl(auVar263._0_32_,auVar90);
    auVar89 = vmulps_avx512vl(auVar266._0_32_,auVar90);
    auVar81 = vfmadd231ps_fma(auVar100,auVar87,auVar246._0_32_);
    auVar75 = vfmadd231ps_fma(auVar91,auVar87,auVar249._0_32_);
    auVar84 = vfmadd231ps_fma(auVar88,auVar87,auVar251._0_32_);
    auVar85 = vfmadd231ps_fma(auVar89,auVar87,auVar253._0_32_);
    auVar88 = vmulps_avx512vl(auVar257._0_32_,auVar90);
    auVar95 = ZEXT1632(auVar82);
    auVar89 = vmulps_avx512vl(auVar258._0_32_,auVar95);
    auVar90 = vmulps_avx512vl(auVar259._0_32_,auVar95);
    auVar91 = vmulps_avx512vl(auVar260._0_32_,auVar95);
    auVar76 = vfmadd231ps_fma(auVar88,auVar87,auVar237._0_32_);
    auVar83 = vfmadd231ps_fma(auVar89,auVar87,auVar254._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar263._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar266._0_32_);
    auVar90 = vmulps_avx512vl(auVar267._0_32_,auVar95);
    auVar91 = vmulps_avx512vl(auVar262._0_32_,auVar95);
    auVar92 = vmulps_avx512vl(auVar264._0_32_,auVar95);
    auVar93 = vmulps_avx512vl(auVar261._0_32_,auVar95);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar87,auVar257._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar87,auVar258._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar92,auVar87,auVar259._0_32_);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar87,auVar260._0_32_);
    auVar256._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar76._12_4_,
                            CONCAT48(fVar168 * auVar76._8_4_,
                                     CONCAT44(fVar166 * auVar76._4_4_,fVar150 * auVar76._0_4_))));
    auVar92 = vmulps_avx512vl(auVar95,ZEXT1632(auVar83));
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar82),auVar88);
    auVar96 = vmulps_avx512vl(ZEXT1632(auVar82),auVar89);
    auVar82 = vfmadd231ps_fma(auVar256._0_32_,auVar87,ZEXT1632(auVar81));
    auVar97 = vfmadd231ps_avx512vl(auVar92,auVar87,ZEXT1632(auVar75));
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar87,ZEXT1632(auVar84));
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar87,ZEXT1632(auVar85));
    auVar101._0_4_ = auVar90._0_4_ * fVar150;
    auVar101._4_4_ = auVar90._4_4_ * fVar166;
    auVar101._8_4_ = auVar90._8_4_ * fVar168;
    auVar101._12_4_ = auVar90._12_4_ * fVar170;
    auVar101._16_4_ = auVar90._16_4_ * 0.0;
    auVar101._20_4_ = auVar90._20_4_ * 0.0;
    auVar101._24_4_ = auVar90._24_4_ * 0.0;
    auVar101._28_4_ = 0;
    auVar92._4_4_ = auVar91._4_4_ * fVar166;
    auVar92._0_4_ = auVar91._0_4_ * fVar150;
    auVar92._8_4_ = auVar91._8_4_ * fVar168;
    auVar92._12_4_ = auVar91._12_4_ * fVar170;
    auVar92._16_4_ = auVar91._16_4_ * 0.0;
    auVar92._20_4_ = auVar91._20_4_ * 0.0;
    auVar92._24_4_ = auVar91._24_4_ * 0.0;
    auVar92._28_4_ = auVar90._28_4_;
    auVar98._4_4_ = auVar94._4_4_ * fVar166;
    auVar98._0_4_ = auVar94._0_4_ * fVar150;
    auVar98._8_4_ = auVar94._8_4_ * fVar168;
    auVar98._12_4_ = auVar94._12_4_ * fVar170;
    auVar98._16_4_ = auVar94._16_4_ * 0.0;
    auVar98._20_4_ = auVar94._20_4_ * 0.0;
    auVar98._24_4_ = auVar94._24_4_ * 0.0;
    auVar98._28_4_ = auVar91._28_4_;
    auVar99._4_4_ = auVar93._4_4_ * fVar166;
    auVar99._0_4_ = auVar93._0_4_ * fVar150;
    auVar99._8_4_ = auVar93._8_4_ * fVar168;
    auVar99._12_4_ = auVar93._12_4_ * fVar170;
    auVar99._16_4_ = auVar93._16_4_ * 0.0;
    auVar99._20_4_ = auVar93._20_4_ * 0.0;
    auVar99._24_4_ = auVar93._24_4_ * 0.0;
    auVar99._28_4_ = auVar94._28_4_;
    auVar81 = vfmadd231ps_fma(auVar101,auVar87,ZEXT1632(auVar76));
    auVar75 = vfmadd231ps_fma(auVar92,auVar87,ZEXT1632(auVar83));
    auVar84 = vfmadd231ps_fma(auVar98,auVar87,auVar88);
    auVar85 = vfmadd231ps_fma(auVar99,auVar87,auVar89);
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar81._12_4_,
                                                 CONCAT48(fVar168 * auVar81._8_4_,
                                                          CONCAT44(fVar166 * auVar81._4_4_,
                                                                   fVar150 * auVar81._0_4_)))),
                              auVar87,ZEXT1632(auVar82));
    auVar98 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar75._12_4_ * fVar170,
                                            CONCAT48(auVar75._8_4_ * fVar168,
                                                     CONCAT44(auVar75._4_4_ * fVar166,
                                                              auVar75._0_4_ * fVar150)))),auVar87,
                         auVar97);
    auVar99 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar84._12_4_ * fVar170,
                                            CONCAT48(auVar84._8_4_ * fVar168,
                                                     CONCAT44(auVar84._4_4_ * fVar166,
                                                              auVar84._0_4_ * fVar150)))),auVar87,
                         auVar95);
    auVar89 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar85._12_4_ * fVar170,
                                            CONCAT48(auVar85._8_4_ * fVar168,
                                                     CONCAT44(auVar85._4_4_ * fVar166,
                                                              auVar85._0_4_ * fVar150)))),auVar96,
                         auVar87);
    auVar87 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar82));
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar75),auVar97);
    auVar90 = vsubps_avx512vl(ZEXT1632(auVar84),auVar95);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar85),auVar96);
    auVar113._0_4_ = fVar132 * auVar87._0_4_ * 3.0;
    auVar113._4_4_ = fVar132 * auVar87._4_4_ * 3.0;
    auVar113._8_4_ = fVar132 * auVar87._8_4_ * 3.0;
    auVar113._12_4_ = fVar132 * auVar87._12_4_ * 3.0;
    auVar113._16_4_ = fVar132 * auVar87._16_4_ * 3.0;
    auVar113._20_4_ = fVar132 * auVar87._20_4_ * 3.0;
    auVar113._24_4_ = fVar132 * auVar87._24_4_ * 3.0;
    auVar113._28_4_ = 0;
    auVar114._0_4_ = fVar132 * auVar88._0_4_ * 3.0;
    auVar114._4_4_ = fVar132 * auVar88._4_4_ * 3.0;
    auVar114._8_4_ = fVar132 * auVar88._8_4_ * 3.0;
    auVar114._12_4_ = fVar132 * auVar88._12_4_ * 3.0;
    auVar114._16_4_ = fVar132 * auVar88._16_4_ * 3.0;
    auVar114._20_4_ = fVar132 * auVar88._20_4_ * 3.0;
    auVar114._24_4_ = fVar132 * auVar88._24_4_ * 3.0;
    auVar114._28_4_ = 0;
    auVar115._0_4_ = fVar132 * auVar90._0_4_ * 3.0;
    auVar115._4_4_ = fVar132 * auVar90._4_4_ * 3.0;
    auVar115._8_4_ = fVar132 * auVar90._8_4_ * 3.0;
    auVar115._12_4_ = fVar132 * auVar90._12_4_ * 3.0;
    auVar115._16_4_ = fVar132 * auVar90._16_4_ * 3.0;
    auVar115._20_4_ = fVar132 * auVar90._20_4_ * 3.0;
    auVar115._24_4_ = fVar132 * auVar90._24_4_ * 3.0;
    auVar115._28_4_ = 0;
    fVar150 = auVar91._0_4_ * 3.0 * fVar132;
    fVar166 = auVar91._4_4_ * 3.0 * fVar132;
    auVar106._4_4_ = fVar166;
    auVar106._0_4_ = fVar150;
    fVar168 = auVar91._8_4_ * 3.0 * fVar132;
    auVar106._8_4_ = fVar168;
    fVar170 = auVar91._12_4_ * 3.0 * fVar132;
    auVar106._12_4_ = fVar170;
    fVar172 = auVar91._16_4_ * 3.0 * fVar132;
    auVar106._16_4_ = fVar172;
    fVar174 = auVar91._20_4_ * 3.0 * fVar132;
    auVar106._20_4_ = fVar174;
    fVar176 = auVar91._24_4_ * 3.0 * fVar132;
    auVar106._24_4_ = fVar176;
    auVar106._28_4_ = fVar132;
    auVar82 = vxorps_avx512vl(auVar266._0_16_,auVar266._0_16_);
    auVar100 = vpermt2ps_avx512vl(ZEXT1632(auVar76),_DAT_01feed00,ZEXT1632(auVar82));
    auVar101 = vpermt2ps_avx512vl(auVar98,_DAT_01feed00,ZEXT1632(auVar82));
    auVar90 = ZEXT1632(auVar82);
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01feed00,auVar90);
    auVar103._0_4_ = auVar89._0_4_ + fVar150;
    auVar103._4_4_ = auVar89._4_4_ + fVar166;
    auVar103._8_4_ = auVar89._8_4_ + fVar168;
    auVar103._12_4_ = auVar89._12_4_ + fVar170;
    auVar103._16_4_ = auVar89._16_4_ + fVar172;
    auVar103._20_4_ = auVar89._20_4_ + fVar174;
    auVar103._24_4_ = auVar89._24_4_ + fVar176;
    auVar103._28_4_ = auVar89._28_4_ + fVar132;
    auVar87 = vmaxps_avx(auVar89,auVar103);
    auVar88 = vminps_avx(auVar89,auVar103);
    auVar93 = vpermt2ps_avx512vl(auVar89,_DAT_01feed00,auVar90);
    auVar103 = vpermt2ps_avx512vl(auVar113,_DAT_01feed00,auVar90);
    auVar104 = vpermt2ps_avx512vl(auVar114,_DAT_01feed00,auVar90);
    auVar110 = ZEXT1632(auVar82);
    auVar105 = vpermt2ps_avx512vl(auVar115,_DAT_01feed00,auVar110);
    auVar89 = vpermt2ps_avx512vl(auVar106,_DAT_01feed00,auVar110);
    auVar89 = vsubps_avx(auVar93,auVar89);
    auVar90 = vsubps_avx(auVar100,ZEXT1632(auVar76));
    auVar91 = vsubps_avx(auVar101,auVar98);
    auVar92 = vsubps_avx(auVar102,auVar99);
    auVar94 = vmulps_avx512vl(auVar91,auVar115);
    auVar94 = vfmsub231ps_avx512vl(auVar94,auVar114,auVar92);
    auVar95 = vmulps_avx512vl(auVar92,auVar113);
    auVar95 = vfmsub231ps_avx512vl(auVar95,auVar115,auVar90);
    auVar96 = vmulps_avx512vl(auVar90,auVar114);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar113,auVar91);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar95 = vfmadd231ps_avx512vl(auVar96,auVar95,auVar95);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar94,auVar94);
    auVar95 = vmulps_avx512vl(auVar92,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar91);
    auVar96 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar90);
    auVar95 = vrcp14ps_avx512vl(auVar96);
    auVar97 = vfnmadd213ps_avx512vl(auVar95,auVar96,auVar111);
    auVar95 = vfmadd132ps_avx512vl(auVar97,auVar95,auVar95);
    auVar94 = vmulps_avx512vl(auVar94,auVar95);
    auVar97 = vmulps_avx512vl(auVar91,auVar105);
    auVar97 = vfmsub231ps_avx512vl(auVar97,auVar104,auVar92);
    auVar106 = vmulps_avx512vl(auVar92,auVar103);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar105,auVar90);
    auVar107 = vmulps_avx512vl(auVar90,auVar104);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar103,auVar91);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar97 = vfmadd231ps_avx512vl(auVar106,auVar97,auVar97);
    auVar95 = vmulps_avx512vl(auVar97,auVar95);
    auVar94 = vmaxps_avx512vl(auVar94,auVar95);
    auVar94 = vsqrtps_avx512vl(auVar94);
    auVar95 = vmaxps_avx512vl(auVar89,auVar93);
    auVar87 = vmaxps_avx512vl(auVar87,auVar95);
    auVar97 = vaddps_avx512vl(auVar94,auVar87);
    auVar87 = vminps_avx(auVar89,auVar93);
    auVar87 = vminps_avx(auVar88,auVar87);
    auVar87 = vsubps_avx512vl(auVar87,auVar94);
    auVar93._8_4_ = 0x3f800002;
    auVar93._0_8_ = 0x3f8000023f800002;
    auVar93._12_4_ = 0x3f800002;
    auVar93._16_4_ = 0x3f800002;
    auVar93._20_4_ = 0x3f800002;
    auVar93._24_4_ = 0x3f800002;
    auVar93._28_4_ = 0x3f800002;
    auVar88 = vmulps_avx512vl(auVar97,auVar93);
    auVar94._8_4_ = 0x3f7ffffc;
    auVar94._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar94._12_4_ = 0x3f7ffffc;
    auVar94._16_4_ = 0x3f7ffffc;
    auVar94._20_4_ = 0x3f7ffffc;
    auVar94._24_4_ = 0x3f7ffffc;
    auVar94._28_4_ = 0x3f7ffffc;
    local_540 = vmulps_avx512vl(auVar87,auVar94);
    auVar87 = vmulps_avx512vl(auVar88,auVar88);
    auVar88 = vrsqrt14ps_avx512vl(auVar96);
    auVar95._8_4_ = 0xbf000000;
    auVar95._0_8_ = 0xbf000000bf000000;
    auVar95._12_4_ = 0xbf000000;
    auVar95._16_4_ = 0xbf000000;
    auVar95._20_4_ = 0xbf000000;
    auVar95._24_4_ = 0xbf000000;
    auVar95._28_4_ = 0xbf000000;
    auVar89 = vmulps_avx512vl(auVar96,auVar95);
    fVar150 = auVar88._0_4_;
    fVar166 = auVar88._4_4_;
    fVar168 = auVar88._8_4_;
    fVar170 = auVar88._12_4_;
    fVar132 = auVar88._16_4_;
    fVar172 = auVar88._20_4_;
    fVar174 = auVar88._24_4_;
    auVar107._4_4_ = fVar166 * fVar166 * fVar166 * auVar89._4_4_;
    auVar107._0_4_ = fVar150 * fVar150 * fVar150 * auVar89._0_4_;
    auVar107._8_4_ = fVar168 * fVar168 * fVar168 * auVar89._8_4_;
    auVar107._12_4_ = fVar170 * fVar170 * fVar170 * auVar89._12_4_;
    auVar107._16_4_ = fVar132 * fVar132 * fVar132 * auVar89._16_4_;
    auVar107._20_4_ = fVar172 * fVar172 * fVar172 * auVar89._20_4_;
    auVar107._24_4_ = fVar174 * fVar174 * fVar174 * auVar89._24_4_;
    auVar107._28_4_ = auVar97._28_4_;
    auVar96._8_4_ = 0x3fc00000;
    auVar96._0_8_ = 0x3fc000003fc00000;
    auVar96._12_4_ = 0x3fc00000;
    auVar96._16_4_ = 0x3fc00000;
    auVar96._20_4_ = 0x3fc00000;
    auVar96._24_4_ = 0x3fc00000;
    auVar96._28_4_ = 0x3fc00000;
    auVar88 = vfmadd231ps_avx512vl(auVar107,auVar88,auVar96);
    auVar89 = vmulps_avx512vl(auVar90,auVar88);
    auVar93 = vmulps_avx512vl(auVar91,auVar88);
    auVar94 = vmulps_avx512vl(auVar92,auVar88);
    auVar121 = ZEXT1632(auVar76);
    auVar95 = vsubps_avx512vl(auVar110,auVar121);
    auVar96 = vsubps_avx512vl(auVar110,auVar98);
    auVar106 = vsubps_avx512vl(auVar110,auVar99);
    auVar108._4_4_ = uStack_31c;
    auVar108._0_4_ = local_320;
    auVar108._8_4_ = uStack_318;
    auVar108._12_4_ = uStack_314;
    auVar108._16_4_ = uStack_310;
    auVar108._20_4_ = uStack_30c;
    auVar108._24_4_ = uStack_308;
    auVar108._28_4_ = uStack_304;
    auVar97 = vmulps_avx512vl(auVar108,auVar106);
    auVar97 = vfmadd231ps_avx512vl(auVar97,local_780,auVar96);
    auVar97 = vfmadd231ps_avx512vl(auVar97,local_300,auVar95);
    auVar107 = vmulps_avx512vl(auVar106,auVar106);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar96,auVar96);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,auVar95);
    auVar108 = vmulps_avx512vl(auVar108,auVar94);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar93,local_780);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar89,local_300);
    auVar256 = ZEXT3264(auVar108);
    auVar94 = vmulps_avx512vl(auVar106,auVar94);
    auVar93 = vfmadd231ps_avx512vl(auVar94,auVar96,auVar93);
    auVar89 = vfmadd231ps_avx512vl(auVar93,auVar95,auVar89);
    auVar93 = vmulps_avx512vl(auVar108,auVar108);
    auVar94 = vsubps_avx512vl(auVar265._0_32_,auVar93);
    auVar109 = vmulps_avx512vl(auVar108,auVar89);
    auVar97 = vsubps_avx512vl(auVar97,auVar109);
    auVar109 = vaddps_avx512vl(auVar97,auVar97);
    auVar97 = vmulps_avx512vl(auVar89,auVar89);
    local_660 = vsubps_avx512vl(auVar107,auVar97);
    auVar87 = vsubps_avx512vl(local_660,auVar87);
    local_560 = vmulps_avx512vl(auVar109,auVar109);
    auVar97._8_4_ = 0x40800000;
    auVar97._0_8_ = 0x4080000040800000;
    auVar97._12_4_ = 0x40800000;
    auVar97._16_4_ = 0x40800000;
    auVar97._20_4_ = 0x40800000;
    auVar97._24_4_ = 0x40800000;
    auVar97._28_4_ = 0x40800000;
    _local_360 = vmulps_avx512vl(auVar94,auVar97);
    auVar97 = vmulps_avx512vl(_local_360,auVar87);
    auVar97 = vsubps_avx512vl(local_560,auVar97);
    uVar71 = vcmpps_avx512vl(auVar97,auVar110,5);
    bVar62 = (byte)uVar71;
    fVar150 = (float)local_5a0._0_4_;
    fVar166 = (float)local_5a0._4_4_;
    fVar168 = fStack_598;
    fVar170 = fStack_594;
    fVar132 = fStack_590;
    fVar172 = fStack_58c;
    fVar174 = fStack_588;
    fVar176 = fStack_584;
    if (bVar62 == 0) {
LAB_01b61b94:
      auVar266 = ZEXT3264(local_7c0);
      auVar264 = ZEXT3264(local_860);
      auVar263 = ZEXT3264(local_7a0);
      auVar262 = ZEXT3264(local_840);
      auVar260 = ZEXT3264(local_820);
      auVar259 = ZEXT3264(local_6a0);
      auVar258 = ZEXT3264(local_800);
      auVar257 = ZEXT3264(local_7e0);
      auVar254 = ZEXT3264(local_680);
      auVar267 = ZEXT3264(local_6c0);
      auVar261 = ZEXT3264(local_6e0);
      auVar253 = ZEXT3264(local_600);
      auVar251 = ZEXT3264(local_760);
      auVar249 = ZEXT3264(local_740);
      auVar246 = ZEXT3264(local_720);
      auVar237 = ZEXT3264(local_420);
      auVar265 = ZEXT3264(local_5e0);
    }
    else {
      auVar107 = _local_360;
      auVar97 = vsqrtps_avx512vl(auVar97);
      local_400 = vaddps_avx512vl(auVar94,auVar94);
      local_3e0 = vrcp14ps_avx512vl(local_400);
      auVar110 = vfnmadd213ps_avx512vl(local_3e0,local_400,auVar111);
      auVar111 = vfmadd132ps_avx512vl(auVar110,local_3e0,local_3e0);
      auVar110._8_4_ = 0x80000000;
      auVar110._0_8_ = 0x8000000080000000;
      auVar110._12_4_ = 0x80000000;
      auVar110._16_4_ = 0x80000000;
      auVar110._20_4_ = 0x80000000;
      auVar110._24_4_ = 0x80000000;
      auVar110._28_4_ = 0x80000000;
      local_580 = vxorps_avx512vl(auVar109,auVar110);
      auVar110 = vsubps_avx512vl(local_580,auVar97);
      local_5c0 = vmulps_avx512vl(auVar110,auVar111);
      auVar97 = vsubps_avx512vl(auVar97,auVar109);
      local_380 = vmulps_avx512vl(auVar97,auVar111);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar97 = vblendmps_avx512vl(auVar97,local_5c0);
      auVar116._0_4_ =
           (uint)(bVar62 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar111._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar111._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar111._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar111._12_4_;
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar116._16_4_ = (uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar111._16_4_;
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar116._20_4_ = (uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar111._20_4_;
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar116._24_4_ = (uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar111._24_4_;
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar116._28_4_ = (uint)bVar14 * auVar97._28_4_ | (uint)!bVar14 * auVar111._28_4_;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar97,local_380);
      auVar112._0_4_ =
           (uint)(bVar62 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar97._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar14 * auVar110._4_4_ | (uint)!bVar14 * auVar97._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar14 * auVar110._8_4_ | (uint)!bVar14 * auVar97._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar14 * auVar110._12_4_ | (uint)!bVar14 * auVar97._12_4_;
      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar14 * auVar110._16_4_ | (uint)!bVar14 * auVar97._16_4_;
      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar14 * auVar110._20_4_ | (uint)!bVar14 * auVar97._20_4_;
      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar14 * auVar110._24_4_ | (uint)!bVar14 * auVar97._24_4_;
      bVar14 = SUB81(uVar71 >> 7,0);
      auVar112._28_4_ = (uint)bVar14 * auVar110._28_4_ | (uint)!bVar14 * auVar97._28_4_;
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar93,auVar97);
      local_3a0 = vmaxps_avx512vl(local_1e0,auVar97);
      auVar111._8_4_ = 0x36000000;
      auVar111._0_8_ = 0x3600000036000000;
      auVar111._12_4_ = 0x36000000;
      auVar111._16_4_ = 0x36000000;
      auVar111._20_4_ = 0x36000000;
      auVar111._24_4_ = 0x36000000;
      auVar111._28_4_ = 0x36000000;
      local_3c0 = vmulps_avx512vl(local_3a0,auVar111);
      vandps_avx512vl(auVar94,auVar97);
      uVar72 = vcmpps_avx512vl(local_3c0,local_3c0,1);
      uVar71 = uVar71 & uVar72;
      bVar65 = (byte)uVar71;
      if (bVar65 != 0) {
        uVar72 = vcmpps_avx512vl(auVar87,_DAT_01faff00,2);
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar94 = vblendmps_avx512vl(auVar87,auVar93);
        bVar15 = (byte)uVar72;
        uVar73 = (uint)(bVar15 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar15 & 1) * local_3c0._0_4_;
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar125 = (uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * local_3c0._4_4_;
        bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar126 = (uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * local_3c0._8_4_;
        bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar127 = (uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * local_3c0._12_4_;
        bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar128 = (uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * local_3c0._16_4_;
        bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar129 = (uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * local_3c0._20_4_;
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar130 = (uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * local_3c0._24_4_;
        bVar14 = SUB81(uVar72 >> 7,0);
        uVar131 = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * local_3c0._28_4_;
        auVar116._0_4_ = (bVar65 & 1) * uVar73 | !(bool)(bVar65 & 1) * auVar116._0_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar116._4_4_ = bVar14 * uVar125 | !bVar14 * auVar116._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar116._8_4_ = bVar14 * uVar126 | !bVar14 * auVar116._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar116._12_4_ = bVar14 * uVar127 | !bVar14 * auVar116._12_4_;
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar116._16_4_ = bVar14 * uVar128 | !bVar14 * auVar116._16_4_;
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar116._20_4_ = bVar14 * uVar129 | !bVar14 * auVar116._20_4_;
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar116._24_4_ = bVar14 * uVar130 | !bVar14 * auVar116._24_4_;
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar116._28_4_ = bVar14 * uVar131 | !bVar14 * auVar116._28_4_;
        auVar87 = vblendmps_avx512vl(auVar93,auVar87);
        bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar20 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar21 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar22 = SUB81(uVar72 >> 7,0);
        auVar112._0_4_ =
             (uint)(bVar65 & 1) *
             ((uint)(bVar15 & 1) * auVar87._0_4_ | !(bool)(bVar15 & 1) * uVar73) |
             !(bool)(bVar65 & 1) * auVar112._0_4_;
        bVar16 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar112._4_4_ =
             (uint)bVar16 * ((uint)bVar14 * auVar87._4_4_ | !bVar14 * uVar125) |
             !bVar16 * auVar112._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar112._8_4_ =
             (uint)bVar14 * ((uint)bVar17 * auVar87._8_4_ | !bVar17 * uVar126) |
             !bVar14 * auVar112._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar112._12_4_ =
             (uint)bVar14 * ((uint)bVar18 * auVar87._12_4_ | !bVar18 * uVar127) |
             !bVar14 * auVar112._12_4_;
        bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar112._16_4_ =
             (uint)bVar14 * ((uint)bVar19 * auVar87._16_4_ | !bVar19 * uVar128) |
             !bVar14 * auVar112._16_4_;
        bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar112._20_4_ =
             (uint)bVar14 * ((uint)bVar20 * auVar87._20_4_ | !bVar20 * uVar129) |
             !bVar14 * auVar112._20_4_;
        bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar112._24_4_ =
             (uint)bVar14 * ((uint)bVar21 * auVar87._24_4_ | !bVar21 * uVar130) |
             !bVar14 * auVar112._24_4_;
        bVar14 = SUB81(uVar71 >> 7,0);
        auVar112._28_4_ =
             (uint)bVar14 * ((uint)bVar22 * auVar87._28_4_ | !bVar22 * uVar131) |
             !bVar14 * auVar112._28_4_;
        bVar62 = (~bVar65 | bVar15) & bVar62;
      }
      auVar265 = ZEXT3264(local_5e0);
      if ((bVar62 & 0x7f) == 0) {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar268 = ZEXT3264(auVar87);
        auVar246 = ZEXT3264(local_720);
        auVar249 = ZEXT3264(local_740);
        auVar251 = ZEXT3264(local_760);
        auVar253 = ZEXT3264(local_600);
        auVar237 = ZEXT3264(local_420);
        auVar254 = ZEXT3264(local_680);
        auVar263 = ZEXT3264(local_7a0);
        auVar266 = ZEXT3264(local_7c0);
        auVar257 = ZEXT3264(local_7e0);
        auVar258 = ZEXT3264(local_800);
        auVar259 = ZEXT3264(local_6a0);
        auVar260 = ZEXT3264(local_820);
        auVar267 = ZEXT3264(local_6c0);
        auVar262 = ZEXT3264(local_840);
        auVar264 = ZEXT3264(local_860);
        auVar261 = ZEXT3264(local_6e0);
      }
      else {
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar93 = vxorps_avx512vl(auVar105,auVar87);
        auVar94 = vxorps_avx512vl(auVar103,auVar87);
        auVar97 = vxorps_avx512vl(auVar104,auVar87);
        auVar82 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]),local_520);
        auVar103 = vbroadcastss_avx512vl(auVar82);
        auVar103 = vmaxps_avx512vl(auVar103,auVar116);
        auVar82 = vsubss_avx512f(ZEXT416((uint)(ray->super_RayK<1>).tfar),local_520);
        auVar104 = vbroadcastss_avx512vl(auVar82);
        auVar110 = vminps_avx512vl(auVar104,auVar112);
        auVar106 = vmulps_avx512vl(auVar106,auVar115);
        auVar96 = vfmadd213ps_avx512vl(auVar96,auVar114,auVar106);
        auVar82 = vfmadd213ps_fma(auVar95,auVar113,auVar96);
        auVar105._4_4_ = uStack_31c;
        auVar105._0_4_ = local_320;
        auVar105._8_4_ = uStack_318;
        auVar105._12_4_ = uStack_314;
        auVar105._16_4_ = uStack_310;
        auVar105._20_4_ = uStack_30c;
        auVar105._24_4_ = uStack_308;
        auVar105._28_4_ = uStack_304;
        auVar95 = vmulps_avx512vl(auVar105,auVar115);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_780,auVar114);
        auVar95 = vfmadd231ps_avx512vl(auVar95,local_300,auVar113);
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar95,auVar96);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar25 = vcmpps_avx512vl(auVar96,auVar106,1);
        auVar113 = vxorps_avx512vl(ZEXT1632(auVar82),auVar87);
        auVar114 = vrcp14ps_avx512vl(auVar95);
        auVar115 = vxorps_avx512vl(auVar95,auVar87);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar104 = vfnmadd213ps_avx512vl(auVar114,auVar95,auVar111);
        auVar82 = vfmadd132ps_fma(auVar104,auVar114,auVar114);
        fVar151 = auVar82._0_4_ * auVar113._0_4_;
        fVar167 = auVar82._4_4_ * auVar113._4_4_;
        auVar104._4_4_ = fVar167;
        auVar104._0_4_ = fVar151;
        fVar169 = auVar82._8_4_ * auVar113._8_4_;
        auVar104._8_4_ = fVar169;
        fVar171 = auVar82._12_4_ * auVar113._12_4_;
        auVar104._12_4_ = fVar171;
        fVar173 = auVar113._16_4_ * 0.0;
        auVar104._16_4_ = fVar173;
        fVar175 = auVar113._20_4_ * 0.0;
        auVar104._20_4_ = fVar175;
        fVar177 = auVar113._24_4_ * 0.0;
        auVar104._24_4_ = fVar177;
        auVar104._28_4_ = auVar113._28_4_;
        uVar26 = vcmpps_avx512vl(auVar95,auVar115,1);
        bVar65 = (byte)uVar25 | (byte)uVar26;
        auVar116 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar104 = vblendmps_avx512vl(auVar104,auVar116);
        auVar117._0_4_ =
             (uint)(bVar65 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar114._0_4_;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        auVar117._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar114._4_4_;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        auVar117._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar114._8_4_;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        auVar117._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar114._12_4_;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        auVar117._16_4_ = (uint)bVar14 * auVar104._16_4_ | (uint)!bVar14 * auVar114._16_4_;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        auVar117._20_4_ = (uint)bVar14 * auVar104._20_4_ | (uint)!bVar14 * auVar114._20_4_;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        auVar117._24_4_ = (uint)bVar14 * auVar104._24_4_ | (uint)!bVar14 * auVar114._24_4_;
        auVar117._28_4_ =
             (uint)(bVar65 >> 7) * auVar104._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar114._28_4_;
        auVar103 = vmaxps_avx512vl(auVar103,auVar117);
        uVar26 = vcmpps_avx512vl(auVar95,auVar115,6);
        bVar65 = (byte)uVar25 | (byte)uVar26;
        auVar118._0_4_ = (uint)(bVar65 & 1) * 0x7f800000 | (uint)!(bool)(bVar65 & 1) * (int)fVar151;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        auVar118._4_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar167;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        auVar118._8_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar169;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        auVar118._12_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar171;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        auVar118._16_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar173;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        auVar118._20_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar175;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        auVar118._24_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar177;
        auVar118._28_4_ =
             (uint)(bVar65 >> 7) * 0x7f800000 | (uint)!(bool)(bVar65 >> 7) * auVar113._28_4_;
        auVar95 = vminps_avx512vl(auVar110,auVar118);
        auVar82 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
        auVar100 = vsubps_avx512vl(ZEXT1632(auVar82),auVar100);
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar82),auVar101);
        auVar104 = ZEXT1632(auVar82);
        auVar102 = vsubps_avx512vl(auVar104,auVar102);
        auVar102 = vmulps_avx512vl(auVar102,auVar93);
        auVar101 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar101);
        auVar100 = vfmadd231ps_avx512vl(auVar101,auVar94,auVar100);
        auVar93 = vmulps_avx512vl(auVar105,auVar93);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_780,auVar97);
        auVar93 = vfmadd231ps_avx512vl(auVar93,local_300,auVar94);
        vandps_avx512vl(auVar93,auVar96);
        uVar25 = vcmpps_avx512vl(auVar93,auVar106,1);
        auVar94 = vxorps_avx512vl(auVar100,auVar87);
        auVar96 = vrcp14ps_avx512vl(auVar93);
        auVar87 = vxorps_avx512vl(auVar93,auVar87);
        auVar97 = vfnmadd213ps_avx512vl(auVar96,auVar93,auVar111);
        auVar82 = vfmadd132ps_fma(auVar97,auVar96,auVar96);
        fVar151 = auVar82._0_4_ * auVar94._0_4_;
        fVar167 = auVar82._4_4_ * auVar94._4_4_;
        auVar102._4_4_ = fVar167;
        auVar102._0_4_ = fVar151;
        fVar169 = auVar82._8_4_ * auVar94._8_4_;
        auVar102._8_4_ = fVar169;
        fVar171 = auVar82._12_4_ * auVar94._12_4_;
        auVar102._12_4_ = fVar171;
        fVar173 = auVar94._16_4_ * 0.0;
        auVar102._16_4_ = fVar173;
        fVar175 = auVar94._20_4_ * 0.0;
        auVar102._20_4_ = fVar175;
        fVar177 = auVar94._24_4_ * 0.0;
        auVar102._24_4_ = fVar177;
        auVar102._28_4_ = auVar94._28_4_;
        uVar26 = vcmpps_avx512vl(auVar93,auVar87,1);
        bVar65 = (byte)uVar25 | (byte)uVar26;
        auVar97 = vblendmps_avx512vl(auVar102,auVar116);
        auVar119._0_4_ =
             (uint)(bVar65 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar96._0_4_;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar14 * auVar97._4_4_ | (uint)!bVar14 * auVar96._4_4_;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar14 * auVar97._8_4_ | (uint)!bVar14 * auVar96._8_4_;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar14 * auVar97._12_4_ | (uint)!bVar14 * auVar96._12_4_;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar14 * auVar97._16_4_ | (uint)!bVar14 * auVar96._16_4_;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar14 * auVar97._20_4_ | (uint)!bVar14 * auVar96._20_4_;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar14 * auVar97._24_4_ | (uint)!bVar14 * auVar96._24_4_;
        auVar119._28_4_ =
             (uint)(bVar65 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar65 >> 7) * auVar96._28_4_;
        _local_4c0 = vmaxps_avx(auVar103,auVar119);
        uVar26 = vcmpps_avx512vl(auVar93,auVar87,6);
        bVar65 = (byte)uVar25 | (byte)uVar26;
        auVar120._0_4_ = (uint)(bVar65 & 1) * 0x7f800000 | (uint)!(bool)(bVar65 & 1) * (int)fVar151;
        bVar14 = (bool)(bVar65 >> 1 & 1);
        auVar120._4_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar167;
        bVar14 = (bool)(bVar65 >> 2 & 1);
        auVar120._8_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar169;
        bVar14 = (bool)(bVar65 >> 3 & 1);
        auVar120._12_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar171;
        bVar14 = (bool)(bVar65 >> 4 & 1);
        auVar120._16_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar173;
        bVar14 = (bool)(bVar65 >> 5 & 1);
        auVar120._20_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar175;
        bVar14 = (bool)(bVar65 >> 6 & 1);
        auVar120._24_4_ = (uint)bVar14 * 0x7f800000 | (uint)!bVar14 * (int)fVar177;
        auVar120._28_4_ =
             (uint)(bVar65 >> 7) * 0x7f800000 | (uint)!(bool)(bVar65 >> 7) * auVar94._28_4_;
        local_220 = vminps_avx(auVar95,auVar120);
        auVar87 = _local_4c0;
        uVar25 = vcmpps_avx512vl(_local_4c0,local_220,2);
        bVar62 = bVar62 & 0x7f & (byte)uVar25;
        if (bVar62 == 0) {
          auVar268 = ZEXT3264(auVar111);
          auVar246 = ZEXT3264(local_720);
          auVar249 = ZEXT3264(local_740);
          auVar251 = ZEXT3264(local_760);
          auVar253 = ZEXT3264(local_600);
          auVar237 = ZEXT3264(local_420);
          auVar254 = ZEXT3264(local_680);
          auVar263 = ZEXT3264(local_7a0);
          auVar266 = ZEXT3264(local_7c0);
          auVar257 = ZEXT3264(local_7e0);
          auVar258 = ZEXT3264(local_800);
          auVar259 = ZEXT3264(local_6a0);
          auVar260 = ZEXT3264(local_820);
          auVar267 = ZEXT3264(local_6c0);
          auVar262 = ZEXT3264(local_840);
          auVar264 = ZEXT3264(local_860);
          auVar261 = ZEXT3264(local_6e0);
          auVar265 = ZEXT3264(local_5e0);
        }
        else {
          auVar94 = vmaxps_avx512vl(auVar104,local_540);
          auVar93 = vfmadd213ps_avx512vl(local_5c0,auVar108,auVar89);
          fVar151 = auVar88._0_4_;
          fVar167 = auVar88._4_4_;
          auVar49._4_4_ = fVar167 * auVar93._4_4_;
          auVar49._0_4_ = fVar151 * auVar93._0_4_;
          fVar169 = auVar88._8_4_;
          auVar49._8_4_ = fVar169 * auVar93._8_4_;
          fVar171 = auVar88._12_4_;
          auVar49._12_4_ = fVar171 * auVar93._12_4_;
          fVar173 = auVar88._16_4_;
          auVar49._16_4_ = fVar173 * auVar93._16_4_;
          fVar175 = auVar88._20_4_;
          auVar49._20_4_ = fVar175 * auVar93._20_4_;
          fVar177 = auVar88._24_4_;
          auVar49._24_4_ = fVar177 * auVar93._24_4_;
          auVar49._28_4_ = auVar93._28_4_;
          auVar93 = vfmadd213ps_avx512vl(local_380,auVar108,auVar89);
          auVar50._4_4_ = fVar167 * auVar93._4_4_;
          auVar50._0_4_ = fVar151 * auVar93._0_4_;
          auVar50._8_4_ = fVar169 * auVar93._8_4_;
          auVar50._12_4_ = fVar171 * auVar93._12_4_;
          auVar50._16_4_ = fVar173 * auVar93._16_4_;
          auVar50._20_4_ = fVar175 * auVar93._20_4_;
          auVar50._24_4_ = fVar177 * auVar93._24_4_;
          auVar50._28_4_ = auVar93._28_4_;
          auVar93 = vminps_avx512vl(auVar49,auVar111);
          auVar95 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar93 = vmaxps_avx(auVar93,ZEXT832(0) << 0x20);
          auVar96 = vminps_avx512vl(auVar50,auVar111);
          auVar51._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
          auVar51._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
          auVar51._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
          auVar51._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
          auVar51._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
          auVar51._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
          auVar51._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
          auVar51._28_4_ = auVar93._28_4_ + 7.0;
          local_1a0 = vfmadd213ps_avx512vl(auVar51,_local_700,_local_8e0);
          auVar93 = vmaxps_avx(auVar96,ZEXT832(0) << 0x20);
          auVar52._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
          auVar52._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
          auVar52._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
          auVar52._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
          auVar52._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
          auVar52._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
          auVar52._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
          auVar52._28_4_ = auVar93._28_4_ + 7.0;
          local_1c0 = vfmadd213ps_avx512vl(auVar52,_local_700,_local_8e0);
          auVar53._4_4_ = auVar94._4_4_ * auVar94._4_4_;
          auVar53._0_4_ = auVar94._0_4_ * auVar94._0_4_;
          auVar53._8_4_ = auVar94._8_4_ * auVar94._8_4_;
          auVar53._12_4_ = auVar94._12_4_ * auVar94._12_4_;
          auVar53._16_4_ = auVar94._16_4_ * auVar94._16_4_;
          auVar53._20_4_ = auVar94._20_4_ * auVar94._20_4_;
          auVar53._24_4_ = auVar94._24_4_ * auVar94._24_4_;
          auVar53._28_4_ = auVar94._28_4_;
          auVar93 = vsubps_avx(local_660,auVar53);
          auVar54._4_4_ = auVar93._4_4_ * (float)local_360._4_4_;
          auVar54._0_4_ = auVar93._0_4_ * (float)local_360._0_4_;
          auVar54._8_4_ = auVar93._8_4_ * fStack_358;
          auVar54._12_4_ = auVar93._12_4_ * fStack_354;
          auVar54._16_4_ = auVar93._16_4_ * fStack_350;
          auVar54._20_4_ = auVar93._20_4_ * fStack_34c;
          auVar54._24_4_ = auVar93._24_4_ * fStack_348;
          auVar54._28_4_ = auVar94._28_4_;
          auVar94 = vsubps_avx(local_560,auVar54);
          uVar71 = vcmpps_avx512vl(auVar94,ZEXT832(0) << 0x20,5);
          auVar267 = ZEXT3264(local_6c0);
          auVar261 = ZEXT3264(local_6e0);
          if ((byte)uVar71 == 0) {
            uVar71 = 0;
            auVar88 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar237 = ZEXT864(0) << 0x20;
            auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
            auVar96 = SUB6432(ZEXT864(0),0) << 0x20;
            auVar247 = ZEXT1228(ZEXT812(0)) << 0x20;
            auVar109._8_4_ = 0x7f800000;
            auVar109._0_8_ = 0x7f8000007f800000;
            auVar109._12_4_ = 0x7f800000;
            auVar109._16_4_ = 0x7f800000;
            auVar109._20_4_ = 0x7f800000;
            auVar109._24_4_ = 0x7f800000;
            auVar109._28_4_ = 0x7f800000;
            auVar121._8_4_ = 0xff800000;
            auVar121._0_8_ = 0xff800000ff800000;
            auVar121._12_4_ = 0xff800000;
            auVar121._16_4_ = 0xff800000;
            auVar121._20_4_ = 0xff800000;
            auVar121._24_4_ = 0xff800000;
            auVar121._28_4_ = 0xff800000;
          }
          else {
            auVar81 = vxorps_avx512vl(auVar219,auVar219);
            uVar72 = vcmpps_avx512vl(auVar94,auVar104,5);
            auVar94 = vsqrtps_avx(auVar94);
            auVar95 = vfnmadd213ps_avx512vl(local_400,local_3e0,auVar111);
            auVar82 = vfmadd132ps_fma(auVar95,local_3e0,local_3e0);
            auVar95 = vsubps_avx(local_580,auVar94);
            auVar55._4_4_ = auVar82._4_4_ * auVar95._4_4_;
            auVar55._0_4_ = auVar82._0_4_ * auVar95._0_4_;
            auVar55._8_4_ = auVar82._8_4_ * auVar95._8_4_;
            auVar55._12_4_ = auVar82._12_4_ * auVar95._12_4_;
            auVar55._16_4_ = auVar95._16_4_ * 0.0;
            auVar55._20_4_ = auVar95._20_4_ * 0.0;
            auVar55._24_4_ = auVar95._24_4_ * 0.0;
            auVar55._28_4_ = 0x3e000000;
            auVar94 = vsubps_avx512vl(auVar94,auVar109);
            auVar56._4_4_ = auVar82._4_4_ * auVar94._4_4_;
            auVar56._0_4_ = auVar82._0_4_ * auVar94._0_4_;
            auVar56._8_4_ = auVar82._8_4_ * auVar94._8_4_;
            auVar56._12_4_ = auVar82._12_4_ * auVar94._12_4_;
            auVar56._16_4_ = auVar94._16_4_ * 0.0;
            auVar56._20_4_ = auVar94._20_4_ * 0.0;
            auVar56._24_4_ = auVar94._24_4_ * 0.0;
            auVar56._28_4_ = local_8e0._0_4_;
            auVar94 = vfmadd213ps_avx512vl(auVar108,auVar55,auVar89);
            auVar248._0_4_ = fVar151 * auVar94._0_4_;
            auVar248._4_4_ = fVar167 * auVar94._4_4_;
            auVar248._8_4_ = fVar169 * auVar94._8_4_;
            auVar248._12_4_ = fVar171 * auVar94._12_4_;
            auVar248._16_4_ = fVar173 * auVar94._16_4_;
            auVar248._20_4_ = fVar175 * auVar94._20_4_;
            auVar248._24_4_ = fVar177 * auVar94._24_4_;
            auVar248._28_4_ = 0;
            auVar94 = vmulps_avx512vl(local_300,auVar55);
            auVar95 = vmulps_avx512vl(local_780,auVar55);
            auVar59._4_4_ = uStack_31c;
            auVar59._0_4_ = local_320;
            auVar59._8_4_ = uStack_318;
            auVar59._12_4_ = uStack_314;
            auVar59._16_4_ = uStack_310;
            auVar59._20_4_ = uStack_30c;
            auVar59._24_4_ = uStack_308;
            auVar59._28_4_ = uStack_304;
            auVar97 = vmulps_avx512vl(auVar59,auVar55);
            auVar96 = vfmadd213ps_avx512vl(auVar90,auVar248,auVar121);
            auVar94 = vsubps_avx512vl(auVar94,auVar96);
            auVar96 = vfmadd213ps_avx512vl(auVar91,auVar248,auVar98);
            auVar96 = vsubps_avx512vl(auVar95,auVar96);
            auVar82 = vfmadd213ps_fma(auVar248,auVar92,auVar99);
            auVar95 = vsubps_avx(auVar97,ZEXT1632(auVar82));
            auVar247 = auVar95._0_28_;
            auVar89 = vfmadd213ps_avx512vl(auVar108,auVar56,auVar89);
            auVar57._4_4_ = fVar167 * auVar89._4_4_;
            auVar57._0_4_ = fVar151 * auVar89._0_4_;
            auVar57._8_4_ = fVar169 * auVar89._8_4_;
            auVar57._12_4_ = fVar171 * auVar89._12_4_;
            auVar57._16_4_ = fVar173 * auVar89._16_4_;
            auVar57._20_4_ = fVar175 * auVar89._20_4_;
            auVar57._24_4_ = fVar177 * auVar89._24_4_;
            auVar57._28_4_ = auVar88._28_4_;
            auVar88 = vmulps_avx512vl(local_300,auVar56);
            auVar89 = vmulps_avx512vl(local_780,auVar56);
            auVar256 = ZEXT3264(auVar89);
            auVar97 = vmulps_avx512vl(auVar59,auVar56);
            auVar82 = vfmadd213ps_fma(auVar90,auVar57,auVar121);
            auVar95 = vsubps_avx(auVar88,ZEXT1632(auVar82));
            auVar82 = vfmadd213ps_fma(auVar91,auVar57,auVar98);
            auVar88 = vsubps_avx(auVar89,ZEXT1632(auVar82));
            auVar82 = vfmadd213ps_fma(auVar92,auVar57,auVar99);
            auVar89 = vsubps_avx512vl(auVar97,ZEXT1632(auVar82));
            auVar237 = ZEXT3264(auVar89);
            auVar198._8_4_ = 0x7f800000;
            auVar198._0_8_ = 0x7f8000007f800000;
            auVar198._12_4_ = 0x7f800000;
            auVar198._16_4_ = 0x7f800000;
            auVar198._20_4_ = 0x7f800000;
            auVar198._24_4_ = 0x7f800000;
            auVar198._28_4_ = 0x7f800000;
            auVar89 = vblendmps_avx512vl(auVar198,auVar55);
            bVar14 = (bool)((byte)uVar72 & 1);
            auVar109._0_4_ = (uint)bVar14 * auVar89._0_4_ | (uint)!bVar14 * auVar76._0_4_;
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar109._4_4_ = (uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar76._4_4_;
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar109._8_4_ = (uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar76._8_4_;
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar109._12_4_ = (uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar76._12_4_;
            iVar1 = (uint)((byte)(uVar72 >> 4) & 1) * auVar89._16_4_;
            auVar109._16_4_ = iVar1;
            iVar2 = (uint)((byte)(uVar72 >> 5) & 1) * auVar89._20_4_;
            auVar109._20_4_ = iVar2;
            iVar3 = (uint)((byte)(uVar72 >> 6) & 1) * auVar89._24_4_;
            auVar109._24_4_ = iVar3;
            iVar4 = (uint)(byte)(uVar72 >> 7) * auVar89._28_4_;
            auVar109._28_4_ = iVar4;
            auVar199._8_4_ = 0xff800000;
            auVar199._0_8_ = 0xff800000ff800000;
            auVar199._12_4_ = 0xff800000;
            auVar199._16_4_ = 0xff800000;
            auVar199._20_4_ = 0xff800000;
            auVar199._24_4_ = 0xff800000;
            auVar199._28_4_ = 0xff800000;
            auVar89 = vblendmps_avx512vl(auVar199,auVar56);
            bVar14 = (bool)((byte)uVar72 & 1);
            auVar121._0_4_ = (uint)bVar14 * auVar89._0_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
            auVar121._4_4_ = (uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
            auVar121._8_4_ = (uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
            auVar121._12_4_ = (uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
            auVar121._16_4_ = (uint)bVar14 * auVar89._16_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
            auVar121._20_4_ = (uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            auVar121._24_4_ = (uint)bVar14 * auVar89._24_4_ | (uint)!bVar14 * -0x800000;
            bVar14 = SUB81(uVar72 >> 7,0);
            auVar121._28_4_ = (uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * -0x800000;
            auVar44._8_4_ = 0x36000000;
            auVar44._0_8_ = 0x3600000036000000;
            auVar44._12_4_ = 0x36000000;
            auVar44._16_4_ = 0x36000000;
            auVar44._20_4_ = 0x36000000;
            auVar44._24_4_ = 0x36000000;
            auVar44._28_4_ = 0x36000000;
            auVar89 = vmulps_avx512vl(local_3a0,auVar44);
            uVar27 = vcmpps_avx512vl(auVar89,local_3c0,0xe);
            uVar72 = uVar72 & uVar27;
            bVar65 = (byte)uVar72;
            if (bVar65 != 0) {
              uVar27 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar81),2);
              auVar242._8_4_ = 0x7f800000;
              auVar242._0_8_ = 0x7f8000007f800000;
              auVar242._12_4_ = 0x7f800000;
              auVar242._16_4_ = 0x7f800000;
              auVar242._20_4_ = 0x7f800000;
              auVar242._24_4_ = 0x7f800000;
              auVar242._28_4_ = 0x7f800000;
              auVar252._8_4_ = 0xff800000;
              auVar252._0_8_ = 0xff800000ff800000;
              auVar252._12_4_ = 0xff800000;
              auVar252._16_4_ = 0xff800000;
              auVar252._20_4_ = 0xff800000;
              auVar252._24_4_ = 0xff800000;
              auVar252._28_4_ = 0xff800000;
              auVar90 = vblendmps_avx512vl(auVar242,auVar252);
              bVar15 = (byte)uVar27;
              uVar73 = (uint)(bVar15 & 1) * auVar90._0_4_ |
                       (uint)!(bool)(bVar15 & 1) * auVar89._0_4_;
              bVar14 = (bool)((byte)(uVar27 >> 1) & 1);
              uVar125 = (uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar89._4_4_;
              bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
              uVar126 = (uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar89._8_4_;
              bVar14 = (bool)((byte)(uVar27 >> 3) & 1);
              uVar127 = (uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar89._12_4_;
              bVar14 = (bool)((byte)(uVar27 >> 4) & 1);
              uVar128 = (uint)bVar14 * auVar90._16_4_ | (uint)!bVar14 * auVar89._16_4_;
              bVar14 = (bool)((byte)(uVar27 >> 5) & 1);
              uVar129 = (uint)bVar14 * auVar90._20_4_ | (uint)!bVar14 * auVar89._20_4_;
              bVar14 = (bool)((byte)(uVar27 >> 6) & 1);
              uVar130 = (uint)bVar14 * auVar90._24_4_ | (uint)!bVar14 * auVar89._24_4_;
              bVar14 = SUB81(uVar27 >> 7,0);
              uVar131 = (uint)bVar14 * auVar90._28_4_ | (uint)!bVar14 * auVar89._28_4_;
              auVar109._0_4_ = (bVar65 & 1) * uVar73 | !(bool)(bVar65 & 1) * auVar109._0_4_;
              bVar14 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar109._4_4_ = bVar14 * uVar125 | !bVar14 * auVar109._4_4_;
              bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar109._8_4_ = bVar14 * uVar126 | !bVar14 * auVar109._8_4_;
              bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar109._12_4_ = bVar14 * uVar127 | !bVar14 * auVar109._12_4_;
              bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar109._16_4_ = bVar14 * uVar128 | (uint)!bVar14 * iVar1;
              bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar109._20_4_ = bVar14 * uVar129 | (uint)!bVar14 * iVar2;
              bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar109._24_4_ = bVar14 * uVar130 | (uint)!bVar14 * iVar3;
              bVar14 = SUB81(uVar72 >> 7,0);
              auVar109._28_4_ = bVar14 * uVar131 | (uint)!bVar14 * iVar4;
              auVar89 = vblendmps_avx512vl(auVar252,auVar242);
              bVar14 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar17 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar18 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar19 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar20 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar21 = (bool)((byte)(uVar27 >> 6) & 1);
              bVar22 = SUB81(uVar27 >> 7,0);
              auVar121._0_4_ =
                   (uint)(bVar65 & 1) *
                   ((uint)(bVar15 & 1) * auVar89._0_4_ | !(bool)(bVar15 & 1) * uVar73) |
                   !(bool)(bVar65 & 1) * auVar121._0_4_;
              bVar16 = (bool)((byte)(uVar72 >> 1) & 1);
              auVar121._4_4_ =
                   (uint)bVar16 * ((uint)bVar14 * auVar89._4_4_ | !bVar14 * uVar125) |
                   !bVar16 * auVar121._4_4_;
              bVar14 = (bool)((byte)(uVar72 >> 2) & 1);
              auVar121._8_4_ =
                   (uint)bVar14 * ((uint)bVar17 * auVar89._8_4_ | !bVar17 * uVar126) |
                   !bVar14 * auVar121._8_4_;
              bVar14 = (bool)((byte)(uVar72 >> 3) & 1);
              auVar121._12_4_ =
                   (uint)bVar14 * ((uint)bVar18 * auVar89._12_4_ | !bVar18 * uVar127) |
                   !bVar14 * auVar121._12_4_;
              bVar14 = (bool)((byte)(uVar72 >> 4) & 1);
              auVar121._16_4_ =
                   (uint)bVar14 * ((uint)bVar19 * auVar89._16_4_ | !bVar19 * uVar128) |
                   !bVar14 * auVar121._16_4_;
              bVar14 = (bool)((byte)(uVar72 >> 5) & 1);
              auVar121._20_4_ =
                   (uint)bVar14 * ((uint)bVar20 * auVar89._20_4_ | !bVar20 * uVar129) |
                   !bVar14 * auVar121._20_4_;
              bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
              auVar121._24_4_ =
                   (uint)bVar14 * ((uint)bVar21 * auVar89._24_4_ | !bVar21 * uVar130) |
                   !bVar14 * auVar121._24_4_;
              bVar14 = SUB81(uVar72 >> 7,0);
              auVar121._28_4_ =
                   (uint)bVar14 * ((uint)bVar22 * auVar89._28_4_ | !bVar22 * uVar131) |
                   !bVar14 * auVar121._28_4_;
              uVar71 = (ulong)(byte)((~bVar65 | bVar15) & (byte)uVar71);
            }
          }
          auVar263 = ZEXT3264(local_7a0);
          auVar266 = ZEXT3264(local_7c0);
          auVar257 = ZEXT3264(local_7e0);
          auVar258 = ZEXT3264(local_800);
          auVar260 = ZEXT3264(local_820);
          auVar262 = ZEXT3264(local_840);
          auVar264 = ZEXT3264(local_860);
          uVar133 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          auVar236._4_4_ = uVar133;
          auVar236._0_4_ = uVar133;
          auVar236._8_4_ = uVar133;
          auVar236._12_4_ = uVar133;
          auVar236._16_4_ = uVar133;
          auVar236._20_4_ = uVar133;
          auVar236._24_4_ = uVar133;
          auVar236._28_4_ = uVar133;
          uVar133 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          auVar243._4_4_ = uVar133;
          auVar243._0_4_ = uVar133;
          auVar243._8_4_ = uVar133;
          auVar243._12_4_ = uVar133;
          auVar243._16_4_ = uVar133;
          auVar243._20_4_ = uVar133;
          auVar243._24_4_ = uVar133;
          auVar243._28_4_ = uVar133;
          fVar151 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar246._0_4_ = fVar151 * auVar237._0_4_;
          auVar246._4_4_ = fVar151 * auVar237._4_4_;
          auVar246._8_4_ = fVar151 * auVar237._8_4_;
          auVar246._12_4_ = fVar151 * auVar237._12_4_;
          auVar246._16_4_ = fVar151 * auVar237._16_4_;
          auVar246._20_4_ = fVar151 * auVar237._20_4_;
          auVar246._28_36_ = auVar237._28_36_;
          auVar246._24_4_ = fVar151 * auVar237._24_4_;
          auVar82 = vfmadd231ps_fma(auVar246._0_32_,auVar243,auVar88);
          auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar236,auVar95);
          _local_280 = _local_4c0;
          local_260 = vminps_avx(local_220,auVar109);
          auVar250._8_4_ = 0x7fffffff;
          auVar250._0_8_ = 0x7fffffff7fffffff;
          auVar250._12_4_ = 0x7fffffff;
          auVar250._16_4_ = 0x7fffffff;
          auVar250._20_4_ = 0x7fffffff;
          auVar250._24_4_ = 0x7fffffff;
          auVar250._28_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar250,ZEXT1632(auVar82));
          _local_240 = vmaxps_avx(_local_4c0,auVar121);
          auVar45._8_4_ = 0x3e99999a;
          auVar45._0_8_ = 0x3e99999a3e99999a;
          auVar45._12_4_ = 0x3e99999a;
          auVar45._16_4_ = 0x3e99999a;
          auVar45._20_4_ = 0x3e99999a;
          auVar45._24_4_ = 0x3e99999a;
          auVar45._28_4_ = 0x3e99999a;
          uVar25 = vcmpps_avx512vl(auVar88,auVar45,1);
          local_8ea = (short)uVar25;
          uVar25 = vcmpps_avx512vl(_local_4c0,local_260,2);
          bVar65 = (byte)uVar25 & bVar62;
          _local_340 = _local_240;
          uVar26 = vcmpps_avx512vl(_local_240,local_220,2);
          auVar254 = ZEXT3264(local_680);
          auVar259 = ZEXT3264(local_6a0);
          if ((bVar62 & ((byte)uVar26 | (byte)uVar25)) == 0) {
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar268 = ZEXT3264(auVar87);
            goto LAB_01b61b94;
          }
          auVar58._4_4_ = auVar247._4_4_ * fVar151;
          auVar58._0_4_ = auVar247._0_4_ * fVar151;
          auVar58._8_4_ = auVar247._8_4_ * fVar151;
          auVar58._12_4_ = auVar247._12_4_ * fVar151;
          auVar58._16_4_ = auVar247._16_4_ * fVar151;
          auVar58._20_4_ = auVar247._20_4_ * fVar151;
          fVar150 = local_240._28_4_;
          auVar58._24_4_ = auVar247._24_4_ * fVar151;
          auVar58._28_4_ = fVar150;
          auVar82 = vfmadd213ps_fma(auVar96,auVar243,auVar58);
          auVar82 = vfmadd213ps_fma(auVar94,auVar236,ZEXT1632(auVar82));
          auVar88 = vandps_avx(auVar250,ZEXT1632(auVar82));
          auVar46._8_4_ = 0x3e99999a;
          auVar46._0_8_ = 0x3e99999a3e99999a;
          auVar46._12_4_ = 0x3e99999a;
          auVar46._16_4_ = 0x3e99999a;
          auVar46._20_4_ = 0x3e99999a;
          auVar46._24_4_ = 0x3e99999a;
          auVar46._28_4_ = 0x3e99999a;
          uVar25 = vcmpps_avx512vl(auVar88,auVar46,1);
          local_86c = (int)CONCAT71((int7)(uVar71 >> 8),~(byte)uVar71);
          bVar15 = (byte)uVar25 | ~(byte)uVar71;
          auVar145._8_4_ = 2;
          auVar145._0_8_ = 0x200000002;
          auVar145._12_4_ = 2;
          auVar145._16_4_ = 2;
          auVar145._20_4_ = 2;
          auVar145._24_4_ = 2;
          auVar145._28_4_ = 2;
          auVar47._8_4_ = 3;
          auVar47._0_8_ = 0x300000003;
          auVar47._12_4_ = 3;
          auVar47._16_4_ = 3;
          auVar47._20_4_ = 3;
          auVar47._24_4_ = 3;
          auVar47._28_4_ = 3;
          auVar88 = vpblendmd_avx512vl(auVar145,auVar47);
          local_200._0_4_ = (uint)(bVar15 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar15 & 1) * 2;
          bVar14 = (bool)(bVar15 >> 1 & 1);
          local_200._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * 2;
          bVar14 = (bool)(bVar15 >> 2 & 1);
          local_200._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * 2;
          bVar14 = (bool)(bVar15 >> 3 & 1);
          local_200._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * 2;
          bVar14 = (bool)(bVar15 >> 4 & 1);
          local_200._16_4_ = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * 2;
          bVar14 = (bool)(bVar15 >> 5 & 1);
          local_200._20_4_ = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * 2;
          bVar14 = (bool)(bVar15 >> 6 & 1);
          local_200._24_4_ = (uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * 2;
          local_200._28_4_ = (uint)(bVar15 >> 7) * auVar88._28_4_ | (uint)!(bool)(bVar15 >> 7) * 2;
          local_2a0 = vpbroadcastd_avx512vl();
          uVar25 = vpcmpd_avx512vl(local_2a0,local_200,5);
          local_868 = (uint)bVar65;
          bVar65 = (byte)uVar25 & bVar65;
          auVar246 = ZEXT3264(local_720);
          _local_360 = auVar107;
          if (bVar65 == 0) {
            fVar166 = (ray->super_RayK<1>).tfar;
            auVar147._4_4_ = fVar166;
            auVar147._0_4_ = fVar166;
            auVar147._8_4_ = fVar166;
            auVar147._12_4_ = fVar166;
            auVar147._16_4_ = fVar166;
            auVar147._20_4_ = fVar166;
            auVar147._24_4_ = fVar166;
            auVar147._28_4_ = fVar166;
            local_340._0_4_ = local_240._0_4_;
            local_340._4_4_ = local_240._4_4_;
            fStack_338 = local_240._8_4_;
            fStack_334 = local_240._12_4_;
            fStack_330 = local_240._16_4_;
            fStack_32c = local_240._20_4_;
            fStack_328 = local_240._24_4_;
            auVar249 = ZEXT3264(local_740);
            auVar251 = ZEXT3264(local_760);
            auVar253 = ZEXT3264(local_600);
            local_4c0._0_4_ = local_340._0_4_;
            local_4c0._4_4_ = local_340._4_4_;
            fStack_4b8 = fStack_338;
            fStack_4b4 = fStack_334;
            fStack_4b0 = fStack_330;
            fStack_4ac = fStack_32c;
            fStack_4a8 = fStack_328;
            fStack_4a4 = fVar150;
          }
          else {
            auVar81 = vminps_avx(local_440._0_16_,local_480._0_16_);
            auVar82 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
            auVar75 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
            auVar84 = vminps_avx(auVar81,auVar75);
            auVar81 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
            auVar75 = vmaxps_avx(auVar82,auVar81);
            auVar182._8_4_ = 0x7fffffff;
            auVar182._0_8_ = 0x7fffffff7fffffff;
            auVar182._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar84,auVar182);
            auVar81 = vandps_avx(auVar75,auVar182);
            auVar82 = vmaxps_avx(auVar82,auVar81);
            auVar81 = vmovshdup_avx(auVar82);
            auVar81 = vmaxss_avx(auVar81,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar81);
            fVar150 = auVar82._0_4_ * 1.9073486e-06;
            local_510 = vshufps_avx(auVar75,auVar75,0xff);
            local_2e0 = (float)local_4c0._0_4_ + (float)local_5a0._0_4_;
            fStack_2dc = (float)local_4c0._4_4_ + (float)local_5a0._4_4_;
            fStack_2d8 = fStack_4b8 + fStack_598;
            fStack_2d4 = fStack_4b4 + fStack_594;
            fStack_2d0 = fStack_4b0 + fStack_590;
            fStack_2cc = fStack_4ac + fStack_58c;
            fStack_2c8 = fStack_4a8 + fStack_588;
            fStack_2c4 = fStack_4a4 + fStack_584;
            _local_4c0 = auVar87;
            do {
              auVar89 = _local_8e0;
              auVar146._8_4_ = 0x7f800000;
              auVar146._0_8_ = 0x7f8000007f800000;
              auVar146._12_4_ = 0x7f800000;
              auVar146._16_4_ = 0x7f800000;
              auVar146._20_4_ = 0x7f800000;
              auVar146._24_4_ = 0x7f800000;
              auVar146._28_4_ = 0x7f800000;
              auVar87 = vblendmps_avx512vl(auVar146,_local_4c0);
              auVar122._0_4_ =
                   (uint)(bVar65 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 1 & 1);
              auVar122._4_4_ = (uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 2 & 1);
              auVar122._8_4_ = (uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 3 & 1);
              auVar122._12_4_ = (uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 4 & 1);
              auVar122._16_4_ = (uint)bVar14 * auVar87._16_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 5 & 1);
              auVar122._20_4_ = (uint)bVar14 * auVar87._20_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 6 & 1);
              auVar122._24_4_ = (uint)bVar14 * auVar87._24_4_ | (uint)!bVar14 * 0x7f800000;
              auVar122._28_4_ =
                   (uint)(bVar65 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar65 >> 7) * 0x7f800000;
              auVar87 = vshufps_avx(auVar122,auVar122,0xb1);
              auVar87 = vminps_avx(auVar122,auVar87);
              auVar88 = vshufpd_avx(auVar87,auVar87,5);
              auVar87 = vminps_avx(auVar87,auVar88);
              auVar88 = vpermpd_avx2(auVar87,0x4e);
              auVar87 = vminps_avx(auVar87,auVar88);
              uVar25 = vcmpps_avx512vl(auVar122,auVar87,0);
              bVar63 = (byte)uVar25 & bVar65;
              bVar15 = bVar65;
              if (bVar63 != 0) {
                bVar15 = bVar63;
              }
              iVar1 = 0;
              for (uVar73 = (uint)bVar15; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar1 = iVar1 + 1;
              }
              aVar6 = (ray->super_RayK<1>).dir.field_0;
              local_540._0_16_ = (undefined1  [16])aVar6;
              auVar82 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
              if (auVar82._0_4_ < 0.0) {
                local_8e0[1] = 0;
                local_8e0[0] = bVar65;
                stack0xfffffffffffff722 = auVar89._2_30_;
                _local_700 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
                local_660._0_16_ = ZEXT416(*(uint *)(local_280 + (uint)(iVar1 << 2)));
                fVar166 = sqrtf(auVar82._0_4_);
                bVar65 = local_8e0[0];
                auVar82 = local_660._0_16_;
                auVar81 = _local_700;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar166 = auVar82._0_4_;
                auVar82 = ZEXT416(*(uint *)(local_280 + (uint)(iVar1 << 2)));
                auVar81 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar1 << 2)));
              }
              local_640._0_4_ = fVar166 * 1.9073486e-06;
              auVar82 = vinsertps_avx(auVar82,auVar81,0x10);
              lVar67 = 5;
              do {
                uVar133 = auVar82._0_4_;
                auVar137._4_4_ = uVar133;
                auVar137._0_4_ = uVar133;
                auVar137._8_4_ = uVar133;
                auVar137._12_4_ = uVar133;
                auVar75 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_540._0_16_);
                auVar81 = vmovshdup_avx(auVar82);
                local_3a0._0_16_ = auVar81;
                fVar172 = 1.0 - auVar81._0_4_;
                auVar81 = vshufps_avx(auVar82,auVar82,0x55);
                fVar166 = auVar81._0_4_;
                auVar183._0_4_ = local_480._0_4_ * fVar166;
                fVar168 = auVar81._4_4_;
                auVar183._4_4_ = local_480._4_4_ * fVar168;
                fVar170 = auVar81._8_4_;
                auVar183._8_4_ = local_480._8_4_ * fVar170;
                fVar132 = auVar81._12_4_;
                auVar183._12_4_ = local_480._12_4_ * fVar132;
                local_380._0_16_ = ZEXT416((uint)fVar172);
                auVar203._4_4_ = fVar172;
                auVar203._0_4_ = fVar172;
                auVar203._8_4_ = fVar172;
                auVar203._12_4_ = fVar172;
                auVar81 = vfmadd231ps_fma(auVar183,auVar203,local_440._0_16_);
                auVar220._0_4_ = local_460._0_4_ * fVar166;
                auVar220._4_4_ = local_460._4_4_ * fVar168;
                auVar220._8_4_ = local_460._8_4_ * fVar170;
                auVar220._12_4_ = local_460._12_4_ * fVar132;
                auVar84 = vfmadd231ps_fma(auVar220,auVar203,local_480._0_16_);
                auVar228._0_4_ = fVar166 * (float)local_4a0._0_4_;
                auVar228._4_4_ = fVar168 * (float)local_4a0._4_4_;
                auVar228._8_4_ = fVar170 * fStack_498;
                auVar228._12_4_ = fVar132 * fStack_494;
                auVar85 = vfmadd231ps_fma(auVar228,auVar203,local_460._0_16_);
                auVar234._0_4_ = fVar166 * auVar84._0_4_;
                auVar234._4_4_ = fVar168 * auVar84._4_4_;
                auVar234._8_4_ = fVar170 * auVar84._8_4_;
                auVar234._12_4_ = fVar132 * auVar84._12_4_;
                auVar81 = vfmadd231ps_fma(auVar234,auVar203,auVar81);
                auVar184._0_4_ = fVar166 * auVar85._0_4_;
                auVar184._4_4_ = fVar168 * auVar85._4_4_;
                auVar184._8_4_ = fVar170 * auVar85._8_4_;
                auVar184._12_4_ = fVar132 * auVar85._12_4_;
                auVar84 = vfmadd231ps_fma(auVar184,auVar203,auVar84);
                auVar221._0_4_ = fVar166 * auVar84._0_4_;
                auVar221._4_4_ = fVar168 * auVar84._4_4_;
                auVar221._8_4_ = fVar170 * auVar84._8_4_;
                auVar221._12_4_ = fVar132 * auVar84._12_4_;
                auVar85 = vfmadd231ps_fma(auVar221,auVar81,auVar203);
                auVar81 = vsubps_avx(auVar84,auVar81);
                auVar34._8_4_ = 0x40400000;
                auVar34._0_8_ = 0x4040000040400000;
                auVar34._12_4_ = 0x40400000;
                auVar81 = vmulps_avx512vl(auVar81,auVar34);
                _local_8e0 = auVar81;
                _local_360 = auVar85;
                auVar81 = vsubps_avx(auVar75,auVar85);
                _local_700 = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                local_660._0_16_ = auVar81;
                local_560._0_16_ = auVar82;
                if (auVar81._0_4_ < 0.0) {
                  auVar237._0_4_ = sqrtf(auVar81._0_4_);
                  auVar237._4_60_ = extraout_var;
                  auVar82 = auVar237._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar81,auVar81);
                }
                local_3c0._0_16_ = vdpps_avx(_local_8e0,_local_8e0,0x7f);
                fVar168 = local_3c0._0_4_;
                auVar185._4_12_ = ZEXT812(0) << 0x20;
                auVar185._0_4_ = fVar168;
                local_5c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
                fVar166 = local_5c0._0_4_ * 1.5;
                local_3e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar185);
                auVar35._8_4_ = 0x80000000;
                auVar35._0_8_ = 0x8000000080000000;
                auVar35._12_4_ = 0x80000000;
                auVar75 = vxorps_avx512vl(local_3c0._0_16_,auVar35);
                auVar81 = vfnmadd213ss_fma(local_3e0._0_16_,local_3c0._0_16_,ZEXT416(0x40000000));
                local_400._0_4_ = auVar81._0_4_;
                local_580._0_4_ = auVar82._0_4_;
                if (fVar168 < auVar75._0_4_) {
                  local_8b0._0_4_ = fVar166;
                  fVar170 = sqrtf(fVar168);
                  auVar82 = ZEXT416((uint)local_580._0_4_);
                }
                else {
                  auVar81 = vsqrtss_avx(local_3c0._0_16_,local_3c0._0_16_);
                  fVar170 = auVar81._0_4_;
                  local_8b0._0_4_ = fVar166;
                }
                fVar166 = local_5c0._0_4_;
                fVar166 = (float)local_8b0._0_4_ + fVar168 * -0.5 * fVar166 * fVar166 * fVar166;
                local_8b0._0_4_ = fVar166 * (float)local_8e0._0_4_;
                local_8b0._4_4_ = fVar166 * (float)local_8e0._4_4_;
                local_8b0._8_4_ = fVar166 * fStack_8d8;
                local_8b0._12_4_ = fVar166 * fStack_8d4;
                local_5c0._0_16_ = vdpps_avx(local_8b0,_local_700,0x7f);
                auVar84 = vaddss_avx512f(auVar82,ZEXT416(0x3f800000));
                auVar138._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
                auVar138._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
                auVar138._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
                auVar138._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
                auVar81 = vsubps_avx(local_660._0_16_,auVar138);
                fVar168 = auVar81._0_4_;
                auVar155._4_12_ = ZEXT812(0) << 0x20;
                auVar155._0_4_ = fVar168;
                auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar155);
                auVar85 = vmulss_avx512f(auVar75,ZEXT416(0x3fc00000));
                auVar76 = vmulss_avx512f(auVar81,ZEXT416(0xbf000000));
                uVar69 = fVar168 == 0.0;
                uVar68 = fVar168 < 0.0;
                if ((bool)uVar68) {
                  local_4f0._0_4_ = auVar76._0_4_;
                  local_500 = fVar166;
                  fStack_4fc = fVar166;
                  fStack_4f8 = fVar166;
                  fStack_4f4 = fVar166;
                  local_4e0 = auVar75;
                  fVar168 = sqrtf(fVar168);
                  auVar76 = ZEXT416((uint)local_4f0._0_4_);
                  auVar85 = ZEXT416(auVar85._0_4_);
                  auVar82 = ZEXT416((uint)local_580._0_4_);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar75 = local_4e0;
                  fVar166 = local_500;
                  fVar132 = fStack_4fc;
                  fVar172 = fStack_4f8;
                  fVar174 = fStack_4f4;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  fVar168 = auVar81._0_4_;
                  fVar132 = fVar166;
                  fVar172 = fVar166;
                  fVar174 = fVar166;
                }
                auVar249 = ZEXT3264(local_740);
                auVar251 = ZEXT3264(local_760);
                auVar253 = ZEXT3264(local_600);
                auVar254 = ZEXT3264(local_680);
                auVar263 = ZEXT3264(local_7a0);
                auVar266 = ZEXT3264(local_7c0);
                auVar257 = ZEXT3264(local_7e0);
                auVar258 = ZEXT3264(local_800);
                auVar259 = ZEXT3264(local_6a0);
                auVar260 = ZEXT3264(local_820);
                auVar267 = ZEXT3264(local_6c0);
                auVar262 = ZEXT3264(local_840);
                auVar264 = ZEXT3264(local_860);
                auVar261 = ZEXT3264(local_6e0);
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_380._0_16_,
                                          local_3a0._0_16_);
                auVar81 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                          local_380._0_16_);
                fVar176 = auVar81._0_4_ * 6.0;
                fVar151 = local_3a0._0_4_ * 6.0;
                auVar204._0_4_ = fVar151 * (float)local_4a0._0_4_;
                auVar204._4_4_ = fVar151 * (float)local_4a0._4_4_;
                auVar204._8_4_ = fVar151 * fStack_498;
                auVar204._12_4_ = fVar151 * fStack_494;
                auVar186._4_4_ = fVar176;
                auVar186._0_4_ = fVar176;
                auVar186._8_4_ = fVar176;
                auVar186._12_4_ = fVar176;
                auVar81 = vfmadd132ps_fma(auVar186,auVar204,local_460._0_16_);
                fVar176 = auVar83._0_4_ * 6.0;
                auVar156._4_4_ = fVar176;
                auVar156._0_4_ = fVar176;
                auVar156._8_4_ = fVar176;
                auVar156._12_4_ = fVar176;
                auVar81 = vfmadd132ps_fma(auVar156,auVar81,local_480._0_16_);
                fVar176 = local_380._0_4_ * 6.0;
                auVar187._4_4_ = fVar176;
                auVar187._0_4_ = fVar176;
                auVar187._8_4_ = fVar176;
                auVar187._12_4_ = fVar176;
                auVar81 = vfmadd132ps_fma(auVar187,auVar81,local_440._0_16_);
                auVar157._0_4_ = auVar81._0_4_ * (float)local_3c0._0_4_;
                auVar157._4_4_ = auVar81._4_4_ * (float)local_3c0._0_4_;
                auVar157._8_4_ = auVar81._8_4_ * (float)local_3c0._0_4_;
                auVar157._12_4_ = auVar81._12_4_ * (float)local_3c0._0_4_;
                auVar81 = vdpps_avx(_local_8e0,auVar81,0x7f);
                fVar176 = auVar81._0_4_;
                auVar188._0_4_ = local_8e0._0_4_ * fVar176;
                auVar188._4_4_ = local_8e0._4_4_ * fVar176;
                auVar188._8_4_ = local_8e0._8_4_ * fVar176;
                auVar188._12_4_ = local_8e0._12_4_ * fVar176;
                auVar81 = vsubps_avx(auVar157,auVar188);
                fVar176 = (float)local_400._0_4_ * (float)local_3e0._0_4_;
                auVar83 = vmaxss_avx(ZEXT416((uint)fVar150),
                                     ZEXT416((uint)(local_560._0_4_ * (float)local_640._0_4_)));
                auVar36._8_4_ = 0x80000000;
                auVar36._0_8_ = 0x8000000080000000;
                auVar36._12_4_ = 0x80000000;
                auVar77 = vxorps_avx512vl(_local_8e0,auVar36);
                auVar189._0_4_ = fVar166 * auVar81._0_4_ * fVar176;
                auVar189._4_4_ = fVar132 * auVar81._4_4_ * fVar176;
                auVar189._8_4_ = fVar172 * auVar81._8_4_ * fVar176;
                auVar189._12_4_ = fVar174 * auVar81._12_4_ * fVar176;
                auVar81 = vdpps_avx(auVar77,local_8b0,0x7f);
                auVar86 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar150),auVar83);
                auVar82 = vdpps_avx(_local_700,auVar189,0x7f);
                vfmadd213ss_avx512f(auVar84,ZEXT416((uint)(fVar150 / fVar170)),auVar86);
                fVar166 = auVar81._0_4_ + auVar82._0_4_;
                auVar82 = vdpps_avx(local_540._0_16_,local_8b0,0x7f);
                auVar81 = vdpps_avx(_local_700,auVar77,0x7f);
                auVar84 = vmulss_avx512f(auVar76,auVar75);
                auVar75 = vmulss_avx512f(auVar75,auVar75);
                auVar76 = vaddss_avx512f(auVar85,ZEXT416((uint)(auVar84._0_4_ * auVar75._0_4_)));
                auVar75 = vdpps_avx(_local_700,local_540._0_16_,0x7f);
                auVar256 = ZEXT1664(local_5c0._0_16_);
                auVar85 = vfnmadd231ss_fma(auVar81,local_5c0._0_16_,ZEXT416((uint)fVar166));
                auVar75 = vfnmadd231ss_fma(auVar75,local_5c0._0_16_,auVar82);
                auVar81 = vpermilps_avx(_local_360,0xff);
                fVar168 = fVar168 - auVar81._0_4_;
                auVar84 = vshufps_avx(_local_8e0,_local_8e0,0xff);
                auVar81 = vfmsub213ss_fma(auVar85,auVar76,auVar84);
                auVar240._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
                auVar240._8_4_ = auVar81._8_4_ ^ 0x80000000;
                auVar240._12_4_ = auVar81._12_4_ ^ 0x80000000;
                auVar75 = ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_));
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)),
                                          ZEXT416((uint)fVar166),auVar75);
                auVar81 = vinsertps_avx(auVar240,auVar75,0x1c);
                auVar229._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar229._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar229._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar75 = vinsertps_avx(ZEXT416((uint)fVar166),auVar229,0x10);
                auVar205._0_4_ = auVar85._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar82 = vdivps_avx(auVar81,auVar205);
                auVar81 = vdivps_avx(auVar75,auVar205);
                fVar166 = local_5c0._0_4_;
                auVar206._0_4_ = fVar166 * auVar82._0_4_ + fVar168 * auVar81._0_4_;
                auVar206._4_4_ = fVar166 * auVar82._4_4_ + fVar168 * auVar81._4_4_;
                auVar206._8_4_ = fVar166 * auVar82._8_4_ + fVar168 * auVar81._8_4_;
                auVar206._12_4_ = fVar166 * auVar82._12_4_ + fVar168 * auVar81._12_4_;
                auVar82 = vsubps_avx(local_560._0_16_,auVar206);
                auVar37._8_4_ = 0x7fffffff;
                auVar37._0_8_ = 0x7fffffff7fffffff;
                auVar37._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(local_5c0._0_16_,auVar37);
                auVar81 = vucomiss_avx512f(auVar81);
                if (!(bool)uVar68 && !(bool)uVar69) {
                  auVar81 = vaddss_avx512f(auVar83,auVar81);
                  auVar81 = vfmadd231ss_fma(auVar81,local_510,ZEXT416(0x36000000));
                  auVar38._8_4_ = 0x7fffffff;
                  auVar38._0_8_ = 0x7fffffff7fffffff;
                  auVar38._12_4_ = 0x7fffffff;
                  auVar75 = vandps_avx512vl(ZEXT416((uint)fVar168),auVar38);
                  if (auVar75._0_4_ < auVar81._0_4_) {
                    fVar166 = auVar82._0_4_ + (float)local_520._0_4_;
                    auVar246 = ZEXT3264(local_720);
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar166) &&
                       (fVar168 = (ray->super_RayK<1>).tfar, fVar166 <= fVar168)) {
                      auVar82 = vmovshdup_avx(auVar82);
                      fVar170 = auVar82._0_4_;
                      if ((0.0 <= fVar170) && (fVar170 <= 1.0)) {
                        auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,
                                                     ZEXT416((uint)local_660._0_4_));
                        fVar132 = auVar82._0_4_;
                        pGVar9 = (context->scene->geometries).items[local_8e8].ptr;
                        if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                          fVar132 = fVar132 * 1.5 +
                                    (float)local_660._0_4_ * -0.5 * fVar132 * fVar132 * fVar132;
                          auVar207._0_4_ = fVar132 * (float)local_700._0_4_;
                          auVar207._4_4_ = fVar132 * (float)local_700._4_4_;
                          auVar207._8_4_ = fVar132 * fStack_6f8;
                          auVar207._12_4_ = fVar132 * fStack_6f4;
                          auVar84 = vfmadd213ps_fma(auVar84,auVar207,_local_8e0);
                          auVar82 = vshufps_avx(auVar207,auVar207,0xc9);
                          auVar81 = vshufps_avx(_local_8e0,_local_8e0,0xc9);
                          auVar208._0_4_ = auVar207._0_4_ * auVar81._0_4_;
                          auVar208._4_4_ = auVar207._4_4_ * auVar81._4_4_;
                          auVar208._8_4_ = auVar207._8_4_ * auVar81._8_4_;
                          auVar208._12_4_ = auVar207._12_4_ * auVar81._12_4_;
                          auVar75 = vfmsub231ps_fma(auVar208,_local_8e0,auVar82);
                          auVar82 = vshufps_avx(auVar75,auVar75,0xc9);
                          auVar81 = vshufps_avx(auVar84,auVar84,0xc9);
                          auVar75 = vshufps_avx(auVar75,auVar75,0xd2);
                          auVar139._0_4_ = auVar84._0_4_ * auVar75._0_4_;
                          auVar139._4_4_ = auVar84._4_4_ * auVar75._4_4_;
                          auVar139._8_4_ = auVar84._8_4_ * auVar75._8_4_;
                          auVar139._12_4_ = auVar84._12_4_ * auVar75._12_4_;
                          auVar82 = vfmsub231ps_fma(auVar139,auVar82,auVar81);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar166;
                            auVar81 = vshufps_avx(auVar82,auVar82,0xe9);
                            uVar25 = vmovlps_avx(auVar81);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar25;
                            (ray->Ng).field_0.field_0.z = auVar82._0_4_;
                            ray->u = fVar170;
                            ray->v = 0.0;
                            ray->primID = (uint)local_8b8;
                            ray->geomID = (uint)local_8e8;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            local_8e0._0_4_ = fVar168;
                            auVar81 = vshufps_avx(auVar82,auVar82,0xe9);
                            local_630 = vmovlps_avx(auVar81);
                            local_628 = auVar82._0_4_;
                            local_624 = fVar170;
                            local_620 = 0;
                            local_61c = (uint)local_8b8;
                            local_618 = (uint)local_8e8;
                            local_614 = context->user->instID[0];
                            local_610 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar166;
                            local_8f0 = -1;
                            local_8a0.valid = &local_8f0;
                            local_8a0.geometryUserPtr = pGVar9->userPtr;
                            local_8a0.context = context->user;
                            local_8a0.ray = (RTCRayN *)ray;
                            local_8a0.hit = (RTCHitN *)&local_630;
                            local_8a0.N = 1;
                            if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b62818:
                              p_Var13 = context->args->filter;
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar256 = ZEXT1664(auVar256._0_16_);
                                (*p_Var13)(&local_8a0);
                                auVar261 = ZEXT3264(local_6e0);
                                auVar264 = ZEXT3264(local_860);
                                auVar262 = ZEXT3264(local_840);
                                auVar267 = ZEXT3264(local_6c0);
                                auVar260 = ZEXT3264(local_820);
                                auVar259 = ZEXT3264(local_6a0);
                                auVar258 = ZEXT3264(local_800);
                                auVar257 = ZEXT3264(local_7e0);
                                auVar266 = ZEXT3264(local_7c0);
                                auVar263 = ZEXT3264(local_7a0);
                                auVar254 = ZEXT3264(local_680);
                                auVar253 = ZEXT3264(local_600);
                                auVar251 = ZEXT3264(local_760);
                                auVar249 = ZEXT3264(local_740);
                                auVar246 = ZEXT3264(local_720);
                                if (*local_8a0.valid == 0) goto LAB_01b62933;
                              }
                              (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_8a0.hit;
                              (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_8a0.hit + 4);
                              (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_8a0.hit + 8);
                              *(float *)((long)local_8a0.ray + 0x3c) =
                                   *(float *)(local_8a0.hit + 0xc);
                              *(float *)((long)local_8a0.ray + 0x40) =
                                   *(float *)(local_8a0.hit + 0x10);
                              *(float *)((long)local_8a0.ray + 0x44) =
                                   *(float *)(local_8a0.hit + 0x14);
                              *(float *)((long)local_8a0.ray + 0x48) =
                                   *(float *)(local_8a0.hit + 0x18);
                              *(float *)((long)local_8a0.ray + 0x4c) =
                                   *(float *)(local_8a0.hit + 0x1c);
                              *(float *)((long)local_8a0.ray + 0x50) =
                                   *(float *)(local_8a0.hit + 0x20);
                            }
                            else {
                              auVar256 = ZEXT1664(local_5c0._0_16_);
                              (*pGVar9->intersectionFilterN)(&local_8a0);
                              auVar261 = ZEXT3264(local_6e0);
                              auVar264 = ZEXT3264(local_860);
                              auVar262 = ZEXT3264(local_840);
                              auVar267 = ZEXT3264(local_6c0);
                              auVar260 = ZEXT3264(local_820);
                              auVar259 = ZEXT3264(local_6a0);
                              auVar258 = ZEXT3264(local_800);
                              auVar257 = ZEXT3264(local_7e0);
                              auVar266 = ZEXT3264(local_7c0);
                              auVar263 = ZEXT3264(local_7a0);
                              auVar254 = ZEXT3264(local_680);
                              auVar253 = ZEXT3264(local_600);
                              auVar251 = ZEXT3264(local_760);
                              auVar249 = ZEXT3264(local_740);
                              auVar246 = ZEXT3264(local_720);
                              if (*local_8a0.valid != 0) goto LAB_01b62818;
LAB_01b62933:
                              (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar67 = lVar67 + -1;
                auVar246 = ZEXT3264(local_720);
              } while (lVar67 != 0);
              fVar166 = (ray->super_RayK<1>).tfar;
              auVar147._4_4_ = fVar166;
              auVar147._0_4_ = fVar166;
              auVar147._8_4_ = fVar166;
              auVar147._12_4_ = fVar166;
              auVar147._16_4_ = fVar166;
              auVar147._20_4_ = fVar166;
              auVar147._24_4_ = fVar166;
              auVar147._28_4_ = fVar166;
              auVar60._4_4_ = fStack_2dc;
              auVar60._0_4_ = local_2e0;
              auVar60._8_4_ = fStack_2d8;
              auVar60._12_4_ = fStack_2d4;
              auVar60._16_4_ = fStack_2d0;
              auVar60._20_4_ = fStack_2cc;
              auVar60._24_4_ = fStack_2c8;
              auVar60._28_4_ = fStack_2c4;
              uVar25 = vcmpps_avx512vl(auVar147,auVar60,0xd);
              bVar65 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar65 & (byte)uVar25;
            } while (bVar65 != 0);
            fVar150 = fStack_324;
            local_4c0._0_4_ = local_240._0_4_;
            local_4c0._4_4_ = local_240._4_4_;
            fStack_4b8 = fStack_238;
            fStack_4b4 = fStack_234;
            fStack_4b0 = fStack_230;
            fStack_4ac = fStack_22c;
            fStack_4a8 = fStack_228;
            fStack_4a4 = fStack_224;
          }
          bVar65 = (byte)local_8ea | (byte)local_86c;
          auVar161._0_4_ = (float)local_5a0._0_4_ + (float)local_340._0_4_;
          auVar161._4_4_ = (float)local_5a0._4_4_ + (float)local_340._4_4_;
          auVar161._8_4_ = fStack_598 + fStack_338;
          auVar161._12_4_ = fStack_594 + fStack_334;
          auVar161._16_4_ = fStack_590 + fStack_330;
          auVar161._20_4_ = fStack_58c + fStack_32c;
          auVar161._24_4_ = fStack_588 + fStack_328;
          auVar161._28_4_ = fStack_584 + fVar150;
          uVar25 = vcmpps_avx512vl(auVar161,auVar147,2);
          bVar62 = (byte)uVar26 & bVar62 & (byte)uVar25;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar48._8_4_ = 3;
          auVar48._0_8_ = 0x300000003;
          auVar48._12_4_ = 3;
          auVar48._16_4_ = 3;
          auVar48._20_4_ = 3;
          auVar48._24_4_ = 3;
          auVar48._28_4_ = 3;
          auVar87 = vpblendmd_avx512vl(auVar162,auVar48);
          local_340._0_4_ = (uint)(bVar65 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar65 & 1) * 2;
          bVar14 = (bool)(bVar65 >> 1 & 1);
          local_340._4_4_ = (uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * 2;
          bVar14 = (bool)(bVar65 >> 2 & 1);
          fStack_338 = (float)((uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * 2);
          bVar14 = (bool)(bVar65 >> 3 & 1);
          fStack_334 = (float)((uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * 2);
          bVar14 = (bool)(bVar65 >> 4 & 1);
          fStack_330 = (float)((uint)bVar14 * auVar87._16_4_ | (uint)!bVar14 * 2);
          bVar14 = (bool)(bVar65 >> 5 & 1);
          fStack_32c = (float)((uint)bVar14 * auVar87._20_4_ | (uint)!bVar14 * 2);
          bVar14 = (bool)(bVar65 >> 6 & 1);
          fStack_328 = (float)((uint)bVar14 * auVar87._24_4_ | (uint)!bVar14 * 2);
          fStack_324 = (float)((uint)(bVar65 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar65 >> 7) * 2
                              );
          uVar25 = vpcmpd_avx512vl(local_2a0,_local_340,5);
          bVar65 = (byte)uVar25 & bVar62;
          fVar150 = (float)local_5a0._0_4_;
          fVar166 = (float)local_5a0._4_4_;
          fVar168 = fStack_598;
          fVar170 = fStack_594;
          fVar132 = fStack_590;
          fVar172 = fStack_58c;
          fVar174 = fStack_588;
          fVar176 = fStack_584;
          if (bVar65 != 0) {
            auVar81 = vminps_avx(local_440._0_16_,local_480._0_16_);
            auVar82 = vmaxps_avx(local_440._0_16_,local_480._0_16_);
            auVar75 = vminps_avx(local_460._0_16_,local_4a0._0_16_);
            auVar84 = vminps_avx(auVar81,auVar75);
            auVar81 = vmaxps_avx(local_460._0_16_,local_4a0._0_16_);
            auVar75 = vmaxps_avx(auVar82,auVar81);
            auVar190._8_4_ = 0x7fffffff;
            auVar190._0_8_ = 0x7fffffff7fffffff;
            auVar190._12_4_ = 0x7fffffff;
            auVar82 = vandps_avx(auVar84,auVar190);
            auVar81 = vandps_avx(auVar75,auVar190);
            auVar82 = vmaxps_avx(auVar82,auVar81);
            auVar81 = vmovshdup_avx(auVar82);
            auVar81 = vmaxss_avx(auVar81,auVar82);
            auVar82 = vshufpd_avx(auVar82,auVar82,1);
            auVar82 = vmaxss_avx(auVar82,auVar81);
            fVar150 = auVar82._0_4_ * 1.9073486e-06;
            local_510 = vshufps_avx(auVar75,auVar75,0xff);
            local_2e0 = (float)local_5a0._0_4_ + (float)local_4c0._0_4_;
            fStack_2dc = (float)local_5a0._4_4_ + (float)local_4c0._4_4_;
            fStack_2d8 = fStack_598 + fStack_4b8;
            fStack_2d4 = fStack_594 + fStack_4b4;
            fStack_2d0 = fStack_590 + fStack_4b0;
            fStack_2cc = fStack_58c + fStack_4ac;
            fStack_2c8 = fStack_588 + fStack_4a8;
            fStack_2c4 = fStack_584 + fStack_4a4;
            do {
              auVar89 = _local_8e0;
              auVar148._8_4_ = 0x7f800000;
              auVar148._0_8_ = 0x7f8000007f800000;
              auVar148._12_4_ = 0x7f800000;
              auVar148._16_4_ = 0x7f800000;
              auVar148._20_4_ = 0x7f800000;
              auVar148._24_4_ = 0x7f800000;
              auVar148._28_4_ = 0x7f800000;
              auVar87 = vblendmps_avx512vl(auVar148,_local_4c0);
              auVar123._0_4_ =
                   (uint)(bVar65 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar65 & 1) * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 1 & 1);
              auVar123._4_4_ = (uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 2 & 1);
              auVar123._8_4_ = (uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 3 & 1);
              auVar123._12_4_ = (uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 4 & 1);
              auVar123._16_4_ = (uint)bVar14 * auVar87._16_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 5 & 1);
              auVar123._20_4_ = (uint)bVar14 * auVar87._20_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar65 >> 6 & 1);
              auVar123._24_4_ = (uint)bVar14 * auVar87._24_4_ | (uint)!bVar14 * 0x7f800000;
              auVar123._28_4_ =
                   (uint)(bVar65 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar65 >> 7) * 0x7f800000;
              auVar87 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar87 = vminps_avx(auVar123,auVar87);
              auVar88 = vshufpd_avx(auVar87,auVar87,5);
              auVar87 = vminps_avx(auVar87,auVar88);
              auVar88 = vpermpd_avx2(auVar87,0x4e);
              auVar87 = vminps_avx(auVar87,auVar88);
              uVar25 = vcmpps_avx512vl(auVar123,auVar87,0);
              bVar63 = (byte)uVar25 & bVar65;
              bVar15 = bVar65;
              if (bVar63 != 0) {
                bVar15 = bVar63;
              }
              iVar1 = 0;
              for (uVar73 = (uint)bVar15; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                iVar1 = iVar1 + 1;
              }
              aVar6 = (ray->super_RayK<1>).dir.field_0;
              local_540._0_16_ = (undefined1  [16])aVar6;
              auVar82 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
              if (auVar82._0_4_ < 0.0) {
                local_8e0[1] = 0;
                local_8e0[0] = bVar65;
                stack0xfffffffffffff722 = auVar89._2_30_;
                _local_700 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
                local_660._0_16_ = ZEXT416(*(uint *)(local_220 + (uint)(iVar1 << 2)));
                fVar166 = sqrtf(auVar82._0_4_);
                bVar65 = local_8e0[0];
                auVar82 = local_660._0_16_;
                auVar81 = _local_700;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar166 = auVar82._0_4_;
                auVar82 = ZEXT416(*(uint *)(local_220 + (uint)(iVar1 << 2)));
                auVar81 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar1 << 2)));
              }
              auVar82 = vinsertps_avx(auVar82,auVar81,0x10);
              lVar67 = 5;
              do {
                uVar133 = auVar82._0_4_;
                auVar140._4_4_ = uVar133;
                auVar140._0_4_ = uVar133;
                auVar140._8_4_ = uVar133;
                auVar140._12_4_ = uVar133;
                auVar75 = vfmadd132ps_fma(auVar140,ZEXT816(0) << 0x40,local_540._0_16_);
                auVar81 = vmovshdup_avx(auVar82);
                local_3a0._0_16_ = auVar81;
                fVar174 = 1.0 - auVar81._0_4_;
                auVar81 = vshufps_avx(auVar82,auVar82,0x55);
                fVar168 = auVar81._0_4_;
                auVar191._0_4_ = local_480._0_4_ * fVar168;
                fVar170 = auVar81._4_4_;
                auVar191._4_4_ = local_480._4_4_ * fVar170;
                fVar132 = auVar81._8_4_;
                auVar191._8_4_ = local_480._8_4_ * fVar132;
                fVar172 = auVar81._12_4_;
                auVar191._12_4_ = local_480._12_4_ * fVar172;
                local_380._0_16_ = ZEXT416((uint)fVar174);
                auVar209._4_4_ = fVar174;
                auVar209._0_4_ = fVar174;
                auVar209._8_4_ = fVar174;
                auVar209._12_4_ = fVar174;
                auVar81 = vfmadd231ps_fma(auVar191,auVar209,local_440._0_16_);
                auVar222._0_4_ = local_460._0_4_ * fVar168;
                auVar222._4_4_ = local_460._4_4_ * fVar170;
                auVar222._8_4_ = local_460._8_4_ * fVar132;
                auVar222._12_4_ = local_460._12_4_ * fVar172;
                auVar84 = vfmadd231ps_fma(auVar222,auVar209,local_480._0_16_);
                auVar230._0_4_ = fVar168 * (float)local_4a0._0_4_;
                auVar230._4_4_ = fVar170 * (float)local_4a0._4_4_;
                auVar230._8_4_ = fVar132 * fStack_498;
                auVar230._12_4_ = fVar172 * fStack_494;
                auVar85 = vfmadd231ps_fma(auVar230,auVar209,local_460._0_16_);
                auVar235._0_4_ = fVar168 * auVar84._0_4_;
                auVar235._4_4_ = fVar170 * auVar84._4_4_;
                auVar235._8_4_ = fVar132 * auVar84._8_4_;
                auVar235._12_4_ = fVar172 * auVar84._12_4_;
                auVar81 = vfmadd231ps_fma(auVar235,auVar209,auVar81);
                auVar192._0_4_ = fVar168 * auVar85._0_4_;
                auVar192._4_4_ = fVar170 * auVar85._4_4_;
                auVar192._8_4_ = fVar132 * auVar85._8_4_;
                auVar192._12_4_ = fVar172 * auVar85._12_4_;
                auVar84 = vfmadd231ps_fma(auVar192,auVar209,auVar84);
                auVar223._0_4_ = fVar168 * auVar84._0_4_;
                auVar223._4_4_ = fVar170 * auVar84._4_4_;
                auVar223._8_4_ = fVar132 * auVar84._8_4_;
                auVar223._12_4_ = fVar172 * auVar84._12_4_;
                auVar85 = vfmadd231ps_fma(auVar223,auVar81,auVar209);
                auVar81 = vsubps_avx(auVar84,auVar81);
                auVar39._8_4_ = 0x40400000;
                auVar39._0_8_ = 0x4040000040400000;
                auVar39._12_4_ = 0x40400000;
                auVar81 = vmulps_avx512vl(auVar81,auVar39);
                _local_8e0 = auVar81;
                _local_360 = auVar85;
                auVar81 = vsubps_avx(auVar75,auVar85);
                _local_700 = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                local_660._0_16_ = auVar81;
                local_560._0_16_ = auVar82;
                if (auVar81._0_4_ < 0.0) {
                  auVar249._0_4_ = sqrtf(auVar81._0_4_);
                  auVar249._4_60_ = extraout_var_00;
                  auVar82 = auVar249._0_16_;
                }
                else {
                  auVar82 = vsqrtss_avx(auVar81,auVar81);
                }
                local_3c0._0_16_ = vdpps_avx(_local_8e0,_local_8e0,0x7f);
                fVar170 = local_3c0._0_4_;
                auVar193._4_12_ = ZEXT812(0) << 0x20;
                auVar193._0_4_ = fVar170;
                local_5c0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
                fVar168 = local_5c0._0_4_ * 1.5;
                local_3e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar193);
                auVar40._8_4_ = 0x80000000;
                auVar40._0_8_ = 0x8000000080000000;
                auVar40._12_4_ = 0x80000000;
                auVar75 = vxorps_avx512vl(local_3c0._0_16_,auVar40);
                auVar81 = vfnmadd213ss_fma(local_3e0._0_16_,local_3c0._0_16_,ZEXT416(0x40000000));
                local_400._0_4_ = auVar81._0_4_;
                local_580._0_4_ = auVar82._0_4_;
                if (fVar170 < auVar75._0_4_) {
                  local_8b0._0_4_ = fVar168;
                  local_640._0_4_ = fVar170 * -0.5;
                  auVar251._0_4_ = sqrtf(fVar170);
                  auVar251._4_60_ = extraout_var_01;
                  auVar82 = ZEXT416((uint)local_580._0_4_);
                  auVar81 = auVar251._0_16_;
                  fVar168 = (float)local_8b0._0_4_;
                }
                else {
                  auVar81 = vsqrtss_avx512f(local_3c0._0_16_,local_3c0._0_16_);
                  local_640._0_4_ = fVar170 * -0.5;
                }
                fVar170 = local_5c0._0_4_;
                fVar168 = fVar168 + (float)local_640._0_4_ * fVar170 * fVar170 * fVar170;
                local_640._0_4_ = fVar168 * (float)local_8e0._0_4_;
                local_640._4_4_ = fVar168 * (float)local_8e0._4_4_;
                local_640._8_4_ = fVar168 * fStack_8d8;
                local_640._12_4_ = fVar168 * fStack_8d4;
                local_5c0._0_16_ = vdpps_avx(_local_700,local_640,0x7f);
                auVar85 = vaddss_avx512f(auVar82,ZEXT416(0x3f800000));
                auVar141._0_4_ = local_5c0._0_4_ * local_5c0._0_4_;
                auVar141._4_4_ = local_5c0._4_4_ * local_5c0._4_4_;
                auVar141._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
                auVar141._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
                auVar75 = vsubps_avx(local_660._0_16_,auVar141);
                fVar170 = auVar75._0_4_;
                auVar158._4_12_ = ZEXT812(0) << 0x20;
                auVar158._0_4_ = fVar170;
                auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
                auVar76 = vmulss_avx512f(auVar84,ZEXT416(0x3fc00000));
                local_8b0._0_4_ = auVar76._0_4_;
                uVar69 = fVar170 == 0.0;
                uVar68 = fVar170 < 0.0;
                if ((bool)uVar68) {
                  local_4e0._0_4_ = auVar85._0_4_;
                  local_500 = fVar168;
                  fStack_4fc = fVar168;
                  fStack_4f8 = fVar168;
                  fStack_4f4 = fVar168;
                  local_4f0 = auVar84;
                  fVar132 = sqrtf(fVar170);
                  auVar81 = ZEXT416(auVar81._0_4_);
                  auVar82 = ZEXT416((uint)local_580._0_4_);
                  auVar85 = ZEXT416((uint)local_4e0._0_4_);
                  auVar84 = local_4f0;
                  fVar168 = local_500;
                  fVar172 = fStack_4fc;
                  fVar174 = fStack_4f8;
                  fVar176 = fStack_4f4;
                }
                else {
                  auVar75 = vsqrtss_avx(auVar75,auVar75);
                  fVar132 = auVar75._0_4_;
                  fVar172 = fVar168;
                  fVar174 = fVar168;
                  fVar176 = fVar168;
                }
                auVar256 = ZEXT1664(_local_700);
                auVar249 = ZEXT3264(local_740);
                auVar251 = ZEXT3264(local_760);
                auVar254 = ZEXT3264(local_680);
                auVar257 = ZEXT3264(local_7e0);
                auVar267 = ZEXT3264(local_6c0);
                auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_380._0_16_,
                                          local_3a0._0_16_);
                auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_3a0._0_16_,
                                          local_380._0_16_);
                fVar151 = auVar75._0_4_ * 6.0;
                fVar167 = local_3a0._0_4_ * 6.0;
                auVar210._0_4_ = fVar167 * (float)local_4a0._0_4_;
                auVar210._4_4_ = fVar167 * (float)local_4a0._4_4_;
                auVar210._8_4_ = fVar167 * fStack_498;
                auVar210._12_4_ = fVar167 * fStack_494;
                auVar194._4_4_ = fVar151;
                auVar194._0_4_ = fVar151;
                auVar194._8_4_ = fVar151;
                auVar194._12_4_ = fVar151;
                auVar75 = vfmadd132ps_fma(auVar194,auVar210,local_460._0_16_);
                fVar151 = auVar76._0_4_ * 6.0;
                auVar159._4_4_ = fVar151;
                auVar159._0_4_ = fVar151;
                auVar159._8_4_ = fVar151;
                auVar159._12_4_ = fVar151;
                auVar75 = vfmadd132ps_fma(auVar159,auVar75,local_480._0_16_);
                fVar151 = local_380._0_4_ * 6.0;
                auVar195._4_4_ = fVar151;
                auVar195._0_4_ = fVar151;
                auVar195._8_4_ = fVar151;
                auVar195._12_4_ = fVar151;
                auVar75 = vfmadd132ps_fma(auVar195,auVar75,local_440._0_16_);
                auVar160._0_4_ = auVar75._0_4_ * (float)local_3c0._0_4_;
                auVar160._4_4_ = auVar75._4_4_ * (float)local_3c0._0_4_;
                auVar160._8_4_ = auVar75._8_4_ * (float)local_3c0._0_4_;
                auVar160._12_4_ = auVar75._12_4_ * (float)local_3c0._0_4_;
                auVar75 = vdpps_avx(_local_8e0,auVar75,0x7f);
                fVar151 = auVar75._0_4_;
                auVar196._0_4_ = local_8e0._0_4_ * fVar151;
                auVar196._4_4_ = local_8e0._4_4_ * fVar151;
                auVar196._8_4_ = local_8e0._8_4_ * fVar151;
                auVar196._12_4_ = local_8e0._12_4_ * fVar151;
                auVar75 = vsubps_avx(auVar160,auVar196);
                fVar151 = (float)local_400._0_4_ * (float)local_3e0._0_4_;
                auVar76 = vmaxss_avx(ZEXT416((uint)fVar150),
                                     ZEXT416((uint)(local_560._0_4_ * fVar166 * 1.9073486e-06)));
                auVar41._8_4_ = 0x80000000;
                auVar41._0_8_ = 0x8000000080000000;
                auVar41._12_4_ = 0x80000000;
                auVar83 = vxorps_avx512vl(_local_8e0,auVar41);
                auVar197._0_4_ = fVar168 * auVar75._0_4_ * fVar151;
                auVar197._4_4_ = fVar172 * auVar75._4_4_ * fVar151;
                auVar197._8_4_ = fVar174 * auVar75._8_4_ * fVar151;
                auVar197._12_4_ = fVar176 * auVar75._12_4_ * fVar151;
                auVar75 = vdpps_avx(auVar83,local_640,0x7f);
                auVar86 = vdivss_avx512f(ZEXT416((uint)fVar150),auVar81);
                auVar81 = vfmadd213ss_fma(auVar82,ZEXT416((uint)fVar150),auVar76);
                auVar82 = vdpps_avx(_local_700,auVar197,0x7f);
                vfmadd213ss_avx512f(auVar85,auVar86,auVar81);
                fVar168 = auVar75._0_4_ + auVar82._0_4_;
                auVar82 = vdpps_avx(local_540._0_16_,local_640,0x7f);
                auVar81 = vdpps_avx(_local_700,auVar83,0x7f);
                auVar75 = vmulss_avx512f(auVar84,ZEXT416((uint)(fVar170 * -0.5)));
                auVar84 = vmulss_avx512f(auVar84,auVar84);
                fVar170 = auVar75._0_4_ * auVar84._0_4_ + (float)local_8b0._0_4_;
                auVar75 = vdpps_avx(_local_700,local_540._0_16_,0x7f);
                auVar85 = vfnmadd231ss_avx512f(auVar81,local_5c0._0_16_,ZEXT416((uint)fVar168));
                auVar75 = vfnmadd231ss_avx512f(auVar75,local_5c0._0_16_,auVar82);
                auVar81 = vpermilps_avx(_local_360,0xff);
                fVar132 = fVar132 - auVar81._0_4_;
                auVar84 = vshufps_avx(_local_8e0,_local_8e0,0xff);
                auVar81 = vfmsub213ss_fma(auVar85,ZEXT416((uint)fVar170),auVar84);
                auVar241._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
                auVar241._8_4_ = auVar81._8_4_ ^ 0x80000000;
                auVar241._12_4_ = auVar81._12_4_ ^ 0x80000000;
                auVar75 = ZEXT416((uint)(auVar75._0_4_ * fVar170));
                auVar85 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar81._0_4_)),
                                          ZEXT416((uint)fVar168),auVar75);
                auVar81 = vinsertps_avx(auVar241,auVar75,0x1c);
                auVar231._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar231._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar231._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar75 = vinsertps_avx(ZEXT416((uint)fVar168),auVar231,0x10);
                auVar211._0_4_ = auVar85._0_4_;
                auVar211._4_4_ = auVar211._0_4_;
                auVar211._8_4_ = auVar211._0_4_;
                auVar211._12_4_ = auVar211._0_4_;
                auVar82 = vdivps_avx(auVar81,auVar211);
                auVar81 = vdivps_avx(auVar75,auVar211);
                auVar75 = vbroadcastss_avx512vl(local_5c0._0_16_);
                auVar212._0_4_ = auVar75._0_4_ * auVar82._0_4_ + fVar132 * auVar81._0_4_;
                auVar212._4_4_ = auVar75._4_4_ * auVar82._4_4_ + fVar132 * auVar81._4_4_;
                auVar212._8_4_ = auVar75._8_4_ * auVar82._8_4_ + fVar132 * auVar81._8_4_;
                auVar212._12_4_ = auVar75._12_4_ * auVar82._12_4_ + fVar132 * auVar81._12_4_;
                auVar82 = vsubps_avx(local_560._0_16_,auVar212);
                auVar42._8_4_ = 0x7fffffff;
                auVar42._0_8_ = 0x7fffffff7fffffff;
                auVar42._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx512vl(local_5c0._0_16_,auVar42);
                auVar81 = vucomiss_avx512f(auVar81);
                if (!(bool)uVar68 && !(bool)uVar69) {
                  auVar81 = vaddss_avx512f(auVar76,auVar81);
                  auVar81 = vfmadd231ss_fma(auVar81,local_510,ZEXT416(0x36000000));
                  auVar43._8_4_ = 0x7fffffff;
                  auVar43._0_8_ = 0x7fffffff7fffffff;
                  auVar43._12_4_ = 0x7fffffff;
                  auVar75 = vandps_avx512vl(ZEXT416((uint)fVar132),auVar43);
                  if (auVar75._0_4_ < auVar81._0_4_) {
                    fVar166 = auVar82._0_4_ + (float)local_520._0_4_;
                    auVar246 = ZEXT3264(local_720);
                    if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar166) &&
                       (fVar168 = (ray->super_RayK<1>).tfar, fVar166 <= fVar168)) {
                      auVar82 = vmovshdup_avx(auVar82);
                      fVar170 = auVar82._0_4_;
                      if ((0.0 <= fVar170) && (fVar170 <= 1.0)) {
                        auVar82 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,
                                                     ZEXT416((uint)local_660._0_4_));
                        fVar132 = auVar82._0_4_;
                        pGVar9 = (context->scene->geometries).items[local_8e8].ptr;
                        if ((pGVar9->mask & (ray->super_RayK<1>).mask) != 0) {
                          fVar132 = fVar132 * 1.5 +
                                    (float)local_660._0_4_ * -0.5 * fVar132 * fVar132 * fVar132;
                          auVar213._0_4_ = local_700._0_4_ * fVar132;
                          auVar213._4_4_ = local_700._4_4_ * fVar132;
                          auVar213._8_4_ = local_700._8_4_ * fVar132;
                          auVar213._12_4_ = local_700._12_4_ * fVar132;
                          auVar84 = vfmadd213ps_fma(auVar84,auVar213,_local_8e0);
                          auVar82 = vshufps_avx(auVar213,auVar213,0xc9);
                          auVar81 = vshufps_avx(_local_8e0,_local_8e0,0xc9);
                          auVar214._0_4_ = auVar213._0_4_ * auVar81._0_4_;
                          auVar214._4_4_ = auVar213._4_4_ * auVar81._4_4_;
                          auVar214._8_4_ = auVar213._8_4_ * auVar81._8_4_;
                          auVar214._12_4_ = auVar213._12_4_ * auVar81._12_4_;
                          auVar75 = vfmsub231ps_fma(auVar214,_local_8e0,auVar82);
                          auVar82 = vshufps_avx(auVar75,auVar75,0xc9);
                          auVar81 = vshufps_avx(auVar84,auVar84,0xc9);
                          auVar75 = vshufps_avx(auVar75,auVar75,0xd2);
                          auVar142._0_4_ = auVar84._0_4_ * auVar75._0_4_;
                          auVar142._4_4_ = auVar84._4_4_ * auVar75._4_4_;
                          auVar142._8_4_ = auVar84._8_4_ * auVar75._8_4_;
                          auVar142._12_4_ = auVar84._12_4_ * auVar75._12_4_;
                          auVar82 = vfmsub231ps_fma(auVar142,auVar82,auVar81);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            (ray->super_RayK<1>).tfar = fVar166;
                            auVar81 = vshufps_avx(auVar82,auVar82,0xe9);
                            uVar25 = vmovlps_avx(auVar81);
                            *(undefined8 *)&(ray->Ng).field_0 = uVar25;
                            (ray->Ng).field_0.field_0.z = auVar82._0_4_;
                            ray->u = fVar170;
                            ray->v = 0.0;
                            ray->primID = (uint)local_8b8;
                            ray->geomID = (uint)local_8e8;
                            ray->instID[0] = context->user->instID[0];
                            ray->instPrimID[0] = context->user->instPrimID[0];
                          }
                          else {
                            local_8e0._0_4_ = fVar168;
                            auVar81 = vshufps_avx(auVar82,auVar82,0xe9);
                            local_630 = vmovlps_avx(auVar81);
                            local_628 = auVar82._0_4_;
                            local_624 = fVar170;
                            local_620 = 0;
                            local_61c = (uint)local_8b8;
                            local_618 = (uint)local_8e8;
                            local_614 = context->user->instID[0];
                            local_610 = context->user->instPrimID[0];
                            (ray->super_RayK<1>).tfar = fVar166;
                            local_8f0 = -1;
                            local_8a0.valid = &local_8f0;
                            local_8a0.geometryUserPtr = pGVar9->userPtr;
                            local_8a0.context = context->user;
                            local_8a0.ray = (RTCRayN *)ray;
                            local_8a0.hit = (RTCHitN *)&local_630;
                            local_8a0.N = 1;
                            if (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01b633db:
                              p_Var13 = context->args->filter;
                              if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar256 = ZEXT1664(auVar256._0_16_);
                                (*p_Var13)(&local_8a0);
                                auVar267 = ZEXT3264(local_6c0);
                                auVar257 = ZEXT3264(local_7e0);
                                auVar254 = ZEXT3264(local_680);
                                auVar251 = ZEXT3264(local_760);
                                auVar249 = ZEXT3264(local_740);
                                auVar246 = ZEXT3264(local_720);
                                if (*local_8a0.valid == 0) goto LAB_01b634fe;
                              }
                              (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).components[0] =
                                   *(float *)local_8a0.hit;
                              (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.y =
                                   *(float *)(local_8a0.hit + 4);
                              (((Vec3f *)((long)local_8a0.ray + 0x30))->field_0).field_0.z =
                                   *(float *)(local_8a0.hit + 8);
                              *(float *)((long)local_8a0.ray + 0x3c) =
                                   *(float *)(local_8a0.hit + 0xc);
                              *(float *)((long)local_8a0.ray + 0x40) =
                                   *(float *)(local_8a0.hit + 0x10);
                              *(float *)((long)local_8a0.ray + 0x44) =
                                   *(float *)(local_8a0.hit + 0x14);
                              *(float *)((long)local_8a0.ray + 0x48) =
                                   *(float *)(local_8a0.hit + 0x18);
                              *(float *)((long)local_8a0.ray + 0x4c) =
                                   *(float *)(local_8a0.hit + 0x1c);
                              *(float *)((long)local_8a0.ray + 0x50) =
                                   *(float *)(local_8a0.hit + 0x20);
                            }
                            else {
                              auVar256 = ZEXT1664(_local_700);
                              (*pGVar9->intersectionFilterN)(&local_8a0);
                              auVar267 = ZEXT3264(local_6c0);
                              auVar257 = ZEXT3264(local_7e0);
                              auVar254 = ZEXT3264(local_680);
                              auVar251 = ZEXT3264(local_760);
                              auVar249 = ZEXT3264(local_740);
                              auVar246 = ZEXT3264(local_720);
                              if (*local_8a0.valid != 0) goto LAB_01b633db;
LAB_01b634fe:
                              (ray->super_RayK<1>).tfar = (float)local_8e0._0_4_;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                }
                lVar67 = lVar67 + -1;
                auVar246 = ZEXT3264(local_720);
              } while (lVar67 != 0);
              fVar166 = (ray->super_RayK<1>).tfar;
              auVar147._4_4_ = fVar166;
              auVar147._0_4_ = fVar166;
              auVar147._8_4_ = fVar166;
              auVar147._12_4_ = fVar166;
              auVar147._16_4_ = fVar166;
              auVar147._20_4_ = fVar166;
              auVar147._24_4_ = fVar166;
              auVar147._28_4_ = fVar166;
              auVar61._4_4_ = fStack_2dc;
              auVar61._0_4_ = local_2e0;
              auVar61._8_4_ = fStack_2d8;
              auVar61._12_4_ = fStack_2d4;
              auVar61._16_4_ = fStack_2d0;
              auVar61._20_4_ = fStack_2cc;
              auVar61._24_4_ = fStack_2c8;
              auVar61._28_4_ = fStack_2c4;
              uVar25 = vcmpps_avx512vl(auVar147,auVar61,0xd);
              bVar65 = ~('\x01' << ((byte)iVar1 & 0x1f)) & bVar65 & (byte)uVar25;
            } while (bVar65 != 0);
            auVar261 = ZEXT3264(local_6e0);
            auVar266 = ZEXT3264(local_7c0);
            auVar263 = ZEXT3264(local_7a0);
            auVar258 = ZEXT3264(local_800);
            auVar260 = ZEXT3264(local_820);
            auVar262 = ZEXT3264(local_840);
            auVar264 = ZEXT3264(local_860);
            auVar259 = ZEXT3264(local_6a0);
            auVar253 = ZEXT3264(local_600);
            local_4c0._0_4_ = local_240._0_4_;
            local_4c0._4_4_ = local_240._4_4_;
            fStack_4b8 = fStack_238;
            fStack_4b4 = fStack_234;
            fStack_4b0 = fStack_230;
            fStack_4ac = fStack_22c;
            fStack_4a8 = fStack_228;
            fStack_4a4 = fStack_224;
            fVar150 = (float)local_5a0._0_4_;
            fVar166 = (float)local_5a0._4_4_;
            fVar168 = fStack_598;
            fVar170 = fStack_594;
            fVar132 = fStack_590;
            fVar172 = fStack_58c;
            fVar174 = fStack_588;
            fVar176 = fStack_584;
          }
          auVar265 = ZEXT3264(local_5e0);
          uVar26 = vpcmpgtd_avx512vl(_local_340,local_2a0);
          uVar28 = vpcmpd_avx512vl(local_2a0,local_200,1);
          auVar200._0_4_ = fVar150 + (float)local_280._0_4_;
          auVar200._4_4_ = fVar166 + (float)local_280._4_4_;
          auVar200._8_4_ = fVar168 + fStack_278;
          auVar200._12_4_ = fVar170 + fStack_274;
          auVar200._16_4_ = fVar132 + fStack_270;
          auVar200._20_4_ = fVar172 + fStack_26c;
          auVar200._24_4_ = fVar174 + fStack_268;
          auVar200._28_4_ = fVar176 + fStack_264;
          uVar25 = vcmpps_avx512vl(auVar200,auVar147,2);
          bVar65 = (byte)local_868 & (byte)uVar28 & (byte)uVar25;
          auVar201._0_4_ = fVar150 + (float)local_4c0._0_4_;
          auVar201._4_4_ = fVar166 + (float)local_4c0._4_4_;
          auVar201._8_4_ = fVar168 + fStack_4b8;
          auVar201._12_4_ = fVar170 + fStack_4b4;
          auVar201._16_4_ = fVar132 + fStack_4b0;
          auVar201._20_4_ = fVar172 + fStack_4ac;
          auVar201._24_4_ = fVar174 + fStack_4a8;
          auVar201._28_4_ = fVar176 + fStack_4a4;
          uVar25 = vcmpps_avx512vl(auVar201,auVar147,2);
          bVar62 = bVar62 & (byte)uVar26 & (byte)uVar25 | bVar65;
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar268 = ZEXT3264(auVar87);
          auVar237 = ZEXT3264(local_420);
          prim = local_4c8;
          if (bVar62 != 0) {
            abStack_180[uVar64 * 0x60] = bVar62;
            bVar14 = (bool)(bVar65 >> 1 & 1);
            bVar16 = (bool)(bVar65 >> 2 & 1);
            bVar17 = (bool)(bVar65 >> 3 & 1);
            bVar18 = (bool)(bVar65 >> 4 & 1);
            bVar19 = (bool)(bVar65 >> 5 & 1);
            bVar20 = (bool)(bVar65 >> 6 & 1);
            auStack_160[uVar64 * 0x18] =
                 (uint)(bVar65 & 1) * local_280._0_4_ | (uint)!(bool)(bVar65 & 1) * local_4c0._0_4_;
            auStack_160[uVar64 * 0x18 + 1] =
                 (uint)bVar14 * local_280._4_4_ | (uint)!bVar14 * local_4c0._4_4_;
            auStack_160[uVar64 * 0x18 + 2] =
                 (uint)bVar16 * (int)fStack_278 | (uint)!bVar16 * (int)fStack_4b8;
            auStack_160[uVar64 * 0x18 + 3] =
                 (uint)bVar17 * (int)fStack_274 | (uint)!bVar17 * (int)fStack_4b4;
            auStack_160[uVar64 * 0x18 + 4] =
                 (uint)bVar18 * (int)fStack_270 | (uint)!bVar18 * (int)fStack_4b0;
            auStack_160[uVar64 * 0x18 + 5] =
                 (uint)bVar19 * (int)fStack_26c | (uint)!bVar19 * (int)fStack_4ac;
            auStack_160[uVar64 * 0x18 + 6] =
                 (uint)bVar20 * (int)fStack_268 | (uint)!bVar20 * (int)fStack_4a8;
            auStack_160[uVar64 * 0x18 + 7] =
                 (uint)(bVar65 >> 7) * (int)fStack_264 |
                 (uint)!(bool)(bVar65 >> 7) * (int)fStack_4a4;
            uVar71 = vmovlps_avx(local_2b0);
            (&uStack_140)[uVar64 * 0xc] = uVar71;
            aiStack_138[uVar64 * 0x18] = local_864 + 1;
            uVar64 = (ulong)((int)uVar64 + 1);
          }
        }
      }
    }
    fVar167 = (ray->super_RayK<1>).tfar;
    fVar151 = (ray->super_RayK<1>).tfar;
    auVar163._4_4_ = fVar151;
    auVar163._0_4_ = fVar151;
    auVar163._8_4_ = fVar151;
    auVar163._12_4_ = fVar151;
    auVar163._16_4_ = fVar151;
    auVar163._20_4_ = fVar151;
    auVar163._24_4_ = fVar151;
    auVar163._28_4_ = fVar151;
    do {
      uVar73 = (uint)uVar64;
      uVar64 = (ulong)(uVar73 - 1);
      if (uVar73 == 0) {
        auVar144._4_4_ = fVar167;
        auVar144._0_4_ = fVar167;
        auVar144._8_4_ = fVar167;
        auVar144._12_4_ = fVar167;
        uVar25 = vcmpps_avx512vl(auVar144,local_2c0,0xd);
        uVar73 = (uint)uVar25 & (uint)uVar70 - 1 & (uint)uVar70;
        uVar70 = (ulong)uVar73;
        if (uVar73 == 0) {
          return;
        }
        goto LAB_01b60e7d;
      }
      auVar87 = *(undefined1 (*) [32])(auStack_160 + uVar64 * 0x18);
      auVar215._0_4_ = fVar150 + auVar87._0_4_;
      auVar215._4_4_ = fVar166 + auVar87._4_4_;
      auVar215._8_4_ = fVar168 + auVar87._8_4_;
      auVar215._12_4_ = fVar170 + auVar87._12_4_;
      auVar215._16_4_ = fVar132 + auVar87._16_4_;
      auVar215._20_4_ = fVar172 + auVar87._20_4_;
      auVar215._24_4_ = fVar174 + auVar87._24_4_;
      auVar215._28_4_ = fVar176 + auVar87._28_4_;
      uVar25 = vcmpps_avx512vl(auVar215,auVar163,2);
      uVar125 = (uint)uVar25 & (uint)abStack_180[uVar64 * 0x60];
    } while (uVar125 == 0);
    uVar71 = (&uStack_140)[uVar64 * 0xc];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar71;
    auVar164._8_4_ = 0x7f800000;
    auVar164._0_8_ = 0x7f8000007f800000;
    auVar164._12_4_ = 0x7f800000;
    auVar164._16_4_ = 0x7f800000;
    auVar164._20_4_ = 0x7f800000;
    auVar164._24_4_ = 0x7f800000;
    auVar164._28_4_ = 0x7f800000;
    auVar87 = vblendmps_avx512vl(auVar164,auVar87);
    bVar62 = (byte)uVar125;
    auVar124._0_4_ = (uint)(bVar62 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
    bVar14 = (bool)((byte)(uVar125 >> 1) & 1);
    auVar124._4_4_ = (uint)bVar14 * auVar87._4_4_ | (uint)!bVar14 * 0x7f800000;
    bVar14 = (bool)((byte)(uVar125 >> 2) & 1);
    auVar124._8_4_ = (uint)bVar14 * auVar87._8_4_ | (uint)!bVar14 * 0x7f800000;
    bVar14 = (bool)((byte)(uVar125 >> 3) & 1);
    auVar124._12_4_ = (uint)bVar14 * auVar87._12_4_ | (uint)!bVar14 * 0x7f800000;
    bVar14 = (bool)((byte)(uVar125 >> 4) & 1);
    auVar124._16_4_ = (uint)bVar14 * auVar87._16_4_ | (uint)!bVar14 * 0x7f800000;
    bVar14 = (bool)((byte)(uVar125 >> 5) & 1);
    auVar124._20_4_ = (uint)bVar14 * auVar87._20_4_ | (uint)!bVar14 * 0x7f800000;
    bVar14 = (bool)((byte)(uVar125 >> 6) & 1);
    auVar124._24_4_ = (uint)bVar14 * auVar87._24_4_ | (uint)!bVar14 * 0x7f800000;
    auVar124._28_4_ = (uVar125 >> 7) * auVar87._28_4_ | (uint)!SUB41(uVar125 >> 7,0) * 0x7f800000;
    auVar87 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar87 = vminps_avx(auVar124,auVar87);
    auVar88 = vshufpd_avx(auVar87,auVar87,5);
    auVar87 = vminps_avx(auVar87,auVar88);
    auVar88 = vpermpd_avx2(auVar87,0x4e);
    auVar87 = vminps_avx(auVar87,auVar88);
    uVar25 = vcmpps_avx512vl(auVar124,auVar87,0);
    bVar65 = (byte)uVar25 & bVar62;
    if (bVar65 != 0) {
      uVar125 = (uint)bVar65;
    }
    uVar126 = 0;
    for (; (uVar125 & 1) == 0; uVar125 = uVar125 >> 1 | 0x80000000) {
      uVar126 = uVar126 + 1;
    }
    local_864 = aiStack_138[uVar64 * 0x18];
    bVar62 = ~('\x01' << ((byte)uVar126 & 0x1f)) & bVar62;
    abStack_180[uVar64 * 0x60] = bVar62;
    if (bVar62 == 0) {
      uVar73 = uVar73 - 1;
    }
    uVar133 = (undefined4)uVar71;
    auVar165._4_4_ = uVar133;
    auVar165._0_4_ = uVar133;
    auVar165._8_4_ = uVar133;
    auVar165._12_4_ = uVar133;
    auVar165._16_4_ = uVar133;
    auVar165._20_4_ = uVar133;
    auVar165._24_4_ = uVar133;
    auVar165._28_4_ = uVar133;
    auVar82 = vmovshdup_avx(auVar143);
    auVar82 = vsubps_avx(auVar82,auVar143);
    auVar149._0_4_ = auVar82._0_4_;
    auVar149._4_4_ = auVar149._0_4_;
    auVar149._8_4_ = auVar149._0_4_;
    auVar149._12_4_ = auVar149._0_4_;
    auVar149._16_4_ = auVar149._0_4_;
    auVar149._20_4_ = auVar149._0_4_;
    auVar149._24_4_ = auVar149._0_4_;
    auVar149._28_4_ = auVar149._0_4_;
    auVar82 = vfmadd132ps_fma(auVar149,auVar165,_DAT_01faff20);
    _local_280 = ZEXT1632(auVar82);
    local_2b0._8_8_ = 0;
    local_2b0._0_8_ = *(ulong *)(local_280 + (ulong)uVar126 * 4);
    uVar64 = (ulong)uVar73;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }